

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int c2mir_compile(MIR_context_t ctx,c2mir_options *ops,_func_int_void_ptr *getc_func,void *getc_data
                 ,char *source_name,FILE *output_file)

{
  char cVar1;
  ushort uVar2;
  FILE *pFVar3;
  long lVar4;
  undefined8 *puVar5;
  bitmap_t pVVar6;
  pre_ctx *ppVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  token_t ptVar12;
  char *__stream;
  c2m_ctx_t pcVar13;
  node_t_conflict pnVar14;
  MIR_context_t pMVar15;
  MIR_module_t_conflict module;
  VARR_char *pVVar16;
  char *pcVar17;
  VARR_pos_t *pVVar18;
  pos_t *ppVar19;
  parse_ctx *ppVar20;
  VARR_stream_t *pVVar21;
  stream_t *ppsVar22;
  VARR_token_t *pVVar23;
  pre_ctx *ppVar24;
  tm *__tp;
  size_t sVar25;
  VARR_char_ptr_t *pVVar26;
  char_ptr_t *ppcVar27;
  VARR_macro_t *pVVar28;
  macro_t *ppmVar29;
  HTAB_macro_t *pHVar30;
  VARR_HTAB_EL_macro_t *pVVar31;
  HTAB_EL_macro_t *pHVar32;
  VARR_htab_ind_t *pVVar33;
  htab_ind_t *phVar34;
  ulong uVar35;
  VARR_ifstate_t *pVVar36;
  ifstate_t *ppiVar37;
  VARR_macro_call_t *pVVar38;
  macro_call_t *ppmVar39;
  HTAB_tpname_t *pHVar40;
  VARR_HTAB_EL_tpname_t *pVVar41;
  HTAB_EL_tpname_t *pHVar42;
  check_ctx *pcVar43;
  c2m_ctx_t pcVar44;
  VARR_node_t *pVVar45;
  node_t_conflict *ppnVar46;
  HTAB_symbol_t *pHVar47;
  VARR_HTAB_EL_symbol_t *pVVar48;
  HTAB_EL_symbol_t *pHVar49;
  HTAB_case_t *pHVar50;
  VARR_HTAB_EL_case_t *pVVar51;
  HTAB_EL_case_t *pHVar52;
  VARR_decl_t *pVVar53;
  decl_t *ppdVar54;
  ulong uVar55;
  c2mir_options *pcVar56;
  token_t ptVar57;
  VARR_init_object_t *pVVar58;
  init_object_t *piVar59;
  stream_t psVar60;
  void *pvVar61;
  code *pcVar62;
  _func_int_void_ptr *extraout_RDX;
  char *fname;
  size_t sVar63;
  gen_ctx *op3;
  node *type;
  char *pcVar64;
  char *pcVar65;
  c2m_ctx_t pcVar66;
  token_t *pptVar67;
  node *n;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 in_XMM2_Qb;
  pos_t pos;
  pos_t pVar82;
  pos_t pos_00;
  pos_t pos_01;
  timeval tv;
  tm tStack_1b0;
  macro_t pmStack_178;
  c2m_ctx_t pcStack_170;
  pre_ctx *ppStack_168;
  ulong uStack_160;
  time_t tStack_158;
  c2m_ctx_t pcStack_150;
  gen_ctx *pgStack_148;
  pre_ctx *ppStack_140;
  c2m_ctx_t pcStack_138;
  c2m_ctx_t pcStack_130;
  gen_ctx *pgStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  gen_ctx *pgStack_f0;
  c2m_ctx_t pcStack_e8;
  gen_ctx *pgStack_e0;
  pre_ctx *ppStack_d8;
  c2m_ctx_t pcStack_d0;
  c2m_ctx_t pcStack_c8;
  gen_ctx *pgStack_c0;
  double local_b8;
  c2m_ctx_t local_b0;
  FILE *local_a8;
  char *local_a0;
  uint local_94;
  undefined1 local_90 [88];
  MIR_context_t local_38;
  
  pcVar44 = (c2m_ctx_t)ctx->c2mir_ctx;
  op3 = (gen_ctx *)0x0;
  pgStack_c0 = (gen_ctx *)0x1775f8;
  local_a8 = (FILE *)output_file;
  local_a0 = source_name;
  gettimeofday((timeval *)local_90,(__timezone_ptr_t)0x0);
  if (pcVar44 == (c2m_ctx_t)0x0) {
    return 0;
  }
  local_90._40_8_ = (undefined8)(long)local_90._8_8_;
  local_90._32_8_ = (undefined8)(long)local_90._0_8_;
  pgStack_c0 = (gen_ctx *)0x177620;
  iVar10 = _setjmp((__jmp_buf_tag *)pcVar44->env);
  if (iVar10 != 0) {
    pgStack_c0 = (gen_ctx *)0x17762c;
    compile_finish(pcVar44);
    return 0;
  }
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_90._40_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_90._32_8_;
  auVar68 = vfmadd231sd_fma(auVar68,auVar75,ZEXT816(0x412e848000000000));
  local_b8 = auVar68._0_8_;
  pgStack_c0 = (gen_ctx *)0x177666;
  local_38 = ctx;
  compile_init(pcVar44,ops,getc_func,getc_data);
  n = (node *)getc_func;
  if ((pcVar44->options->verbose_p != 0) &&
     (pFVar3 = (FILE *)pcVar44->options->message_file, pFVar3 != (FILE *)0x0)) {
    n = (node *)local_90;
    pgStack_c0 = (gen_ctx *)0x177689;
    gettimeofday((timeval *)n,(__timezone_ptr_t)0x0);
    auVar69._0_8_ = (double)(long)local_90._8_8_;
    auVar69._8_8_ = in_XMM2_Qb;
    auVar76._0_8_ = (double)(long)local_90._0_8_;
    auVar76._8_8_ = in_XMM2_Qb;
    vfmadd132sd_fma(auVar76,auVar69,ZEXT816(0x412e848000000000));
    pgStack_c0 = (gen_ctx *)0x1776b3;
    fprintf(pFVar3,"C2MIR init end           -- %.0f usec\n");
  }
  pcVar62 = top_level_getc;
  type = (node *)0x0;
  pgStack_c0 = (gen_ctx *)0x1776cb;
  pcVar65 = (char *)pcVar44;
  add_stream(pcVar44,(FILE *)0x0,local_a0,top_level_getc);
  pcVar17 = (char *)pcVar62;
  if (pcVar44->options->no_prepro_p == 0) {
    op3 = (gen_ctx *)0x8;
    ops = (c2mir_options *)0x0;
    do {
      if (*(long *)(&UNK_001e4ce8 + (long)op3) == 0) {
        pcVar17 = *(char **)((long)&standard_includes[0].name + (long)op3);
        pcVar62 = str_getc;
        pgStack_c0 = (gen_ctx *)0x17770f;
        type = (node *)ops;
        pcVar65 = (char *)pcVar44;
        add_stream(pcVar44,(FILE *)0x0,"<environment>",str_getc);
        psVar60 = pcVar44->cs;
        psVar60->curr = pcVar17;
        psVar60->start = pcVar17;
      }
      op3 = (gen_ctx *)((long)op3 + 0x10);
      pcVar17 = (char *)pcVar62;
      ctx = (MIR_context_t)standard_includes;
      n = (node *)str_getc;
    } while (op3 != (gen_ctx *)0xb8);
  }
  __stream = (char *)pcVar44->pre_ctx;
  ((c2m_ctx_t)__stream)->eof_s = (stream_t)0x0;
  ((c2m_ctx_t)__stream)->str_tab = (HTAB_tab_str_t *)0x0;
  ((c2m_ctx_t)__stream)->str_key_tab = (HTAB_tab_str_t *)0x0;
  (((c2m_ctx_t)__stream)->empty_str).s = (char *)0x0;
  (((c2m_ctx_t)__stream)->empty_str).len = (size_t)common_pre_out;
  pMVar15 = ((c2m_ctx_t)__stream)->ctx;
  if ((pMVar15 != (MIR_context_t)0x0) && (pMVar15->error_func != (MIR_error_func_t)0x0)) {
    pMVar15->gen_ctx = (gen_ctx *)0x0;
    if (pcVar44->options->no_prepro_p == 0) {
      pgStack_c0 = (gen_ctx *)0x1777b8;
      processing(pcVar44,0);
    }
    else {
      op3 = (gen_ctx *)0x0;
      while( true ) {
        pgStack_c0 = (gen_ctx *)0x177789;
        ptVar12 = get_next_pptoken_1(pcVar44,0);
        uVar2 = *(ushort *)ptVar12;
        pcVar17 = (char *)(ulong)uVar2;
        if ((uVar2 == 0x13d) || (uVar2 == 0x147)) break;
        pgStack_c0 = (gen_ctx *)0x1777a9;
        (*(code *)(((c2m_ctx_t)__stream)->empty_str).len)(pcVar44,ptVar12);
      }
    }
    pcVar64 = (char *)0x0;
    pgStack_c0 = (gen_ctx *)0x1777c6;
    (*(code *)(((c2m_ctx_t)__stream)->empty_str).len)(pcVar44);
    if ((pcVar44->options->verbose_p != 0) &&
       (pcVar65 = (char *)pcVar44->options->message_file, (c2m_ctx_t)pcVar65 != (c2m_ctx_t)0x0)) {
      type = (node *)ops;
      if (pcVar44->recorded_tokens == (VARR_token_t *)0x0) goto LAB_00177f03;
      pcVar17 = (char *)pcVar44->recorded_tokens->els_num;
      pgStack_c0 = (gen_ctx *)0x177800;
      fprintf((FILE *)pcVar65,"    preprocessor tokens -- %lu, parse tokens -- %lu\n",
              (((c2m_ctx_t)__stream)->empty_str).s);
    }
    if ((pcVar44->options->verbose_p != 0) &&
       (__stream = (char *)pcVar44->options->message_file, (c2m_ctx_t)__stream != (c2m_ctx_t)0x0)) {
      n = (node *)local_90;
      pgStack_c0 = (gen_ctx *)0x177823;
      gettimeofday((timeval *)n,(__timezone_ptr_t)0x0);
      auVar70._0_8_ = (double)(long)local_90._8_8_;
      auVar70._8_8_ = in_XMM2_Qb;
      auVar77._0_8_ = (double)(long)local_90._0_8_;
      auVar77._8_8_ = in_XMM2_Qb;
      vfmadd132sd_fma(auVar77,auVar70,ZEXT816(0x412e848000000000));
      pgStack_c0 = (gen_ctx *)0x17784d;
      fprintf((FILE *)__stream,"  C2MIR preprocessor end    -- %.0f usec\n");
    }
    if (pcVar44->options->prepro_only_p != 0) goto LAB_00177b82;
    ppVar20 = pcVar44->parse_ctx;
    ppVar20->next_token_index = 0;
    pgStack_c0 = (gen_ctx *)0x177873;
    read_token(pcVar44);
    pgStack_c0 = (gen_ctx *)0x177880;
    ctx = (MIR_context_t)new_node(pcVar44,N_LIST);
    if (*(short *)ppVar20->curr_token != 0x13d) {
      type = &err_struct;
      local_90._80_8_ = ctx;
      do {
        pgStack_c0 = (gen_ctx *)0x1778a7;
        __stream = (char *)record_start(pcVar44);
        pgStack_c0 = (gen_ctx *)0x1778b7;
        pcVar13 = (c2m_ctx_t)declaration(pcVar44,1);
        pgStack_c0 = (gen_ctx *)0x1778cf;
        record_stop(pcVar44,(size_t)__stream,(uint)(pcVar13 == (c2m_ctx_t)&err_struct));
        n = (node *)pcVar13;
        if (pcVar13 == (c2m_ctx_t)&err_struct) {
          pgStack_c0 = (gen_ctx *)0x1778fa;
          pcVar13 = (c2m_ctx_t)declaration_specs(pcVar44,0,(node_t_conflict)&DAT_00000001);
          if (pcVar13 != (c2m_ctx_t)&err_struct) {
            pgStack_c0 = (gen_ctx *)0x177911;
            __stream = (char *)declarator(pcVar44,0);
            n = (node *)pcVar13;
            if ((node *)__stream != &err_struct) {
              n = &err_struct;
              pgStack_c0 = (gen_ctx *)0x177932;
              local_90._72_8_ = pcVar13;
              op3 = (gen_ctx *)new_node(pcVar44,N_LIST);
              ((c2m_ctx_t)__stream)->options = (c2mir_options *)ppVar20->curr_scope;
              ppVar20->curr_scope = (node_t_conflict)__stream;
              local_b0 = (c2m_ctx_t)__stream;
              while (*(short *)ppVar20->curr_token != 0x7b) {
                pgStack_c0 = (gen_ctx *)0x17795d;
                pnVar14 = declaration(pcVar44,0);
                if (pnVar14 == &err_struct) {
                  ppVar20->curr_scope = (node_t_conflict)local_b0->options;
                  goto LAB_00177aba;
                }
                pgStack_c0 = (gen_ctx *)0x177974;
                op_flat_append(pcVar44,(node_t_conflict)op3,pnVar14);
              }
              ctx = (MIR_context_t)local_b0->env[0].__jmpbuf[2];
              ppVar24 = (pre_ctx *)ctx;
              if ((pre_ctx *)ctx != (pre_ctx *)0x0) {
                ppVar24 = (pre_ctx *)((pre_ctx *)ctx)->macros;
              }
              pnVar14 = (node_t_conflict)ppVar24->ifs;
              if ((pnVar14 == (node_t_conflict)0x0) || (pnVar14->code != N_FUNC)) {
                pgStack_c0 = (gen_ctx *)0x177a05;
                pVar82 = get_node_pos(pcVar44,(node_t_conflict)ctx);
                pcVar17 = "non-function declaration %s before \'{\'";
                pgStack_c0 = (gen_ctx *)0x177a23;
                error(pcVar44,0x1c3724,pVar82.fname,pVar82._8_8_,
                      (node_t_conflict)((pre_ctx *)ctx)->ifs);
              }
              else {
                ctx = (MIR_context_t)(((pnVar14->u).ops.head)->u).ops.head;
                if ((pre_ctx *)ctx != (pre_ctx *)0x0) {
                  do {
                    if (*(int *)&((pre_ctx *)ctx)->once_include_files == 0x55) {
                      pnVar14 = (node_t_conflict)((pre_ctx *)ctx)->ifs;
                      if (pnVar14 != (node_t_conflict)0x0) {
                        pnVar14 = (pnVar14->op_link).next;
                      }
                      ppVar24 = (pre_ctx *)(pnVar14->u).ops.head;
                      pcVar17 = (char *)ppVar20->curr_scope;
LAB_001779e4:
                      pgStack_c0 = (gen_ctx *)0x1779ec;
                      tpname_add((tpname_t *)local_90,pcVar44,(node_t_conflict)ppVar24,
                                 (node_t_conflict)pcVar17,0);
                    }
                    else if (*(int *)&((pre_ctx *)ctx)->once_include_files == 0x10) {
                      pcVar17 = (char *)ppVar20->curr_scope;
                      ppVar24 = (pre_ctx *)ctx;
                      goto LAB_001779e4;
                    }
                    ctx = (MIR_context_t)((pre_ctx *)ctx)->macros;
                  } while ((pre_ctx *)ctx != (pre_ctx *)0x0);
                  ctx = (MIR_context_t)0x0;
                }
              }
              pcVar64 = (char *)0x0;
              pgStack_c0 = (gen_ctx *)0x177a2d;
              pcVar65 = (char *)pcVar44;
              pnVar14 = compound_stmt(pcVar44,0);
              uVar9 = local_90._72_8_;
              pcVar66 = local_b0;
              n = type;
              if (pnVar14 != &err_struct) {
                pgStack_c0 = (gen_ctx *)0x177a50;
                local_90._48_8_ = pnVar14;
                pVar82 = get_node_pos(pcVar44,(node_t_conflict)local_b0);
                local_90._56_8_ = pVar82._8_8_;
                local_90._64_8_ = pVar82.fname;
                pgStack_c0 = (gen_ctx *)0x177a75;
                pcVar13 = (c2m_ctx_t)
                          new_node4(pcVar44,N_FUNC_DEF,(node_t_conflict)uVar9,
                                    (node_t_conflict)pcVar66,(node_t_conflict)op3,
                                    (node_t_conflict)local_90._48_8_);
                pgStack_c0 = (gen_ctx *)0x177a8d;
                pVar82.lno = local_90._56_4_;
                pVar82.ln_pos = local_90._60_4_;
                pVar82.fname = (char *)local_90._64_8_;
                pcVar17 = (char *)local_90._56_8_;
                add_pos(pcVar44,(node_t_conflict)pcVar13,pVar82);
                ppVar20->curr_scope = (node_t_conflict)pcVar66->options;
                ctx = (MIR_context_t)local_90._80_8_;
                __stream = (char *)pcVar13;
                goto LAB_001778d7;
              }
              goto LAB_00177afa;
            }
          }
LAB_00177aba:
          __stream = (char *)0x0;
          pgStack_c0 = (gen_ctx *)0x177acc;
          error_recovery(pcVar44,0,"<declarator>");
        }
        else {
LAB_001778d7:
          pgStack_c0 = (gen_ctx *)0x1778e2;
          op_flat_append(pcVar44,(node_t_conflict)ctx,(node_t_conflict)pcVar13);
        }
        op3 = (gen_ctx *)type;
      } while (*(short *)ppVar20->curr_token != 0x13d);
    }
    pgStack_c0 = (gen_ctx *)0x177ae9;
    type = new_node(pcVar44,N_MODULE);
    pgStack_c0 = (gen_ctx *)0x177afa;
    pcVar64 = (char *)type;
    pcVar65 = (char *)pcVar44;
    op_append(pcVar44,type,(node_t_conflict)ctx);
LAB_00177afa:
    if ((pcVar44->options->verbose_p != 0) &&
       (__stream = (char *)pcVar44->options->message_file, (c2m_ctx_t)__stream != (c2m_ctx_t)0x0)) {
      n = (node *)local_90;
      pgStack_c0 = (gen_ctx *)0x177b1d;
      gettimeofday((timeval *)n,(__timezone_ptr_t)0x0);
      auVar71._0_8_ = (double)(long)local_90._8_8_;
      auVar71._8_8_ = in_XMM2_Qb;
      auVar78._0_8_ = (double)(long)local_90._0_8_;
      auVar78._8_8_ = in_XMM2_Qb;
      vfmadd132sd_fma(auVar78,auVar71,ZEXT816(0x412e848000000000));
      pcVar64 = "  C2MIR parser end          -- %.0f usec\n";
      pgStack_c0 = (gen_ctx *)0x177b47;
      pcVar65 = __stream;
      fprintf((FILE *)__stream,"  C2MIR parser end          -- %.0f usec\n");
    }
    if (((pcVar44->options->verbose_p != 0) &&
        (pcVar17 = (char *)pcVar44->options->message_file,
        (MIR_context_t)pcVar17 != (MIR_context_t)0x0)) && (pcVar44->n_errors != 0)) {
      pcVar65 = "parser - FAIL\n";
      pcVar64 = (char *)0xe;
      pgStack_c0 = (gen_ctx *)0x177b78;
      fwrite("parser - FAIL\n",0xe,1,(FILE *)pcVar17);
    }
    if (pcVar44->options->syntax_only_p != 0) goto LAB_00177b82;
    pVVar45 = pcVar44->call_nodes;
    if ((pVVar45 == (VARR_node_t *)0x0) || (pVVar45->varr == (node_t_conflict *)0x0))
    goto LAB_00177f08;
    local_94 = pcVar44->n_errors;
    pcVar17 = (char *)(ulong)local_94;
    ctx = (MIR_context_t)pcVar44->check_ctx;
    pVVar45->els_num = 0;
    pVVar45 = *(VARR_node_t **)((pre_ctx *)ctx)->date_str;
    if ((pVVar45 == (VARR_node_t *)0x0) || (pVVar45->varr == (node_t_conflict *)0x0))
    goto LAB_00177f0d;
    pVVar45->els_num = 0;
    pgStack_c0 = (gen_ctx *)0x177c5d;
    pcVar65 = (char *)pcVar44;
    local_90._24_8_ = type;
    check(pcVar44,type,(node_t_conflict)0x0);
    pMVar15 = *(MIR_context_t *)((pre_ctx *)ctx)->date_str;
    if (pMVar15 != (MIR_context_t)0x0) {
      op3 = (gen_ctx *)0x0;
      __stream = "incomplete struct or union";
      ops = (c2mir_options *)op3;
      do {
        if (pMVar15->gen_ctx <= ops) goto LAB_00177ccb;
        if (pMVar15->error_func == (MIR_error_func_t)0x0) {
          pgStack_c0 = (gen_ctx *)0x177efb;
          c2mir_compile_cold_2();
          goto LAB_00177efb;
        }
        n = *(node **)(pMVar15->error_func + (long)ops * 8);
        type = (node *)((c2m_ctx_t)n)->options->output_file_name;
        pgStack_c0 = (gen_ctx *)0x177c98;
        pcVar65 = (char *)pcVar44;
        iVar10 = incomplete_type_p(pcVar44,(type *)type);
        if (iVar10 != 0) {
          pgStack_c0 = (gen_ctx *)0x177ca7;
          pVar82 = get_node_pos(pcVar44,n);
          type = (node *)pVar82.fname;
          pgStack_c0 = (gen_ctx *)0x177cb7;
          pcVar65 = (char *)pcVar44;
          error(pcVar44,0x1c3b72,(char *)type,pVar82._8_8_);
        }
        ops = (c2mir_options *)((long)&((gen_ctx *)ops)->ctx + 1);
        pMVar15 = *(MIR_context_t *)((pre_ctx *)ctx)->date_str;
        pcVar17 = (char *)pMVar15;
      } while (pMVar15 != (MIR_context_t)0x0);
    }
    pgStack_c0 = (gen_ctx *)0x177ccb;
    c2mir_compile_cold_3();
LAB_00177ccb:
    uVar9 = local_90._24_8_;
    pcVar56 = pcVar44->options;
    if (local_94 < pcVar44->n_errors) {
      if (pcVar56->debug_p != 0) {
        pgStack_c0 = (gen_ctx *)0x177cf7;
        print_node(pcVar44,pcVar56->message_file,(node_t_conflict)local_90._24_8_,0,0);
      }
      if ((pcVar44->options->verbose_p != 0) &&
         (pFVar3 = (FILE *)pcVar44->options->message_file, pFVar3 != (FILE *)0x0)) {
        pgStack_c0 = (gen_ctx *)0x177d27;
        fwrite("C2MIR context checker - FAIL\n",0x1d,1,pFVar3);
      }
      goto LAB_00177b82;
    }
    if (pcVar56->debug_p != 0) {
      pgStack_c0 = (gen_ctx *)0x177d4b;
      print_node(pcVar44,pcVar56->message_file,(node_t_conflict)local_90._24_8_,0,1);
    }
    pMVar15 = local_38;
    if ((pcVar44->options->verbose_p != 0) &&
       (pFVar3 = (FILE *)pcVar44->options->message_file, pFVar3 != (FILE *)0x0)) {
      pgStack_c0 = (gen_ctx *)0x177d76;
      gettimeofday((timeval *)local_90,(__timezone_ptr_t)0x0);
      auVar73._0_8_ = (double)(long)local_90._8_8_;
      auVar73._8_8_ = in_XMM2_Qb;
      auVar80._0_8_ = (double)(long)local_90._0_8_;
      auVar80._8_8_ = in_XMM2_Qb;
      auVar68 = vfmadd132sd_fma(auVar80,auVar73,ZEXT816(0x412e848000000000));
      pgStack_c0 = (gen_ctx *)0x177da0;
      fprintf(pFVar3,"  C2MIR context checker end -- %.0f usec\n",auVar68._0_8_ - local_b8);
    }
    pgStack_c0 = (gen_ctx *)0x177dc0;
    sprintf(pcVar44->temp_str_buff,"M%ld",pcVar44->options->module_num);
    pgStack_c0 = (gen_ctx *)0x177dcb;
    module = MIR_new_module(pMVar15,pcVar44->temp_str_buff);
    pgStack_c0 = (gen_ctx *)0x177dd9;
    gen_mir(pcVar44,(node_t_conflict)uVar9);
    pcVar56 = pcVar44->options;
    iVar10 = pcVar56->asm_p;
    if (((iVar10 != 0) || (pcVar56->object_p != 0)) && (pcVar44->n_errors == 0)) {
      pgStack_c0 = (gen_ctx *)0x177e68;
      iVar11 = strcmp(local_a0,"<command-line>");
      pFVar3 = local_a8;
      if (iVar11 == 0) {
        pgStack_c0 = (gen_ctx *)0x177e97;
        MIR_output_module(pMVar15,pcVar56->message_file,module);
      }
      else if (local_a8 != (FILE *)0x0) {
        if (iVar10 == 0) {
          pcVar62 = MIR_write_module;
        }
        else {
          pcVar62 = MIR_output_module;
        }
        pgStack_c0 = (gen_ctx *)0x177eb3;
        (*pcVar62)(pMVar15,local_a8,module);
        pgStack_c0 = (gen_ctx *)0x177ebb;
        iVar10 = ferror(pFVar3);
        if (iVar10 == 0) {
          pgStack_c0 = (gen_ctx *)0x177ec9;
          iVar10 = fclose(local_a8);
          if (iVar10 == 0) goto LAB_00177df5;
        }
        pgStack_c0 = (gen_ctx *)0x177eeb;
        fprintf((FILE *)pcVar44->options->message_file,
                "C2MIR error in writing mir for source file %s\n",local_a0);
        pcVar44->n_errors = pcVar44->n_errors + 1;
      }
    }
LAB_00177df5:
    pgStack_c0 = (gen_ctx *)0x177dfd;
    MIR_finish_module(pMVar15);
    if ((pcVar44->options->verbose_p != 0) &&
       (pFVar3 = (FILE *)pcVar44->options->message_file, pFVar3 != (FILE *)0x0)) {
      pgStack_c0 = (gen_ctx *)0x177e28;
      gettimeofday((timeval *)local_90,(__timezone_ptr_t)0x0);
      auVar74._0_8_ = (double)(long)local_90._8_8_;
      auVar74._8_8_ = in_XMM2_Qb;
      auVar81._0_8_ = (double)(long)local_90._0_8_;
      auVar81._8_8_ = in_XMM2_Qb;
      auVar68 = vfmadd132sd_fma(auVar81,auVar74,ZEXT816(0x412e848000000000));
      pgStack_c0 = (gen_ctx *)0x177e52;
      fprintf(pFVar3,"  C2MIR generator end       -- %.0f usec\n",auVar68._0_8_ - local_b8);
    }
LAB_00177b82:
    pgStack_c0 = (gen_ctx *)0x177b8a;
    compile_finish(pcVar44);
    if ((pcVar44->options->verbose_p != 0) &&
       (pFVar3 = (FILE *)pcVar44->options->message_file, pFVar3 != (FILE *)0x0)) {
      pgStack_c0 = (gen_ctx *)0x177bad;
      gettimeofday((timeval *)local_90,(__timezone_ptr_t)0x0);
      auVar72._0_8_ = (double)(long)local_90._8_8_;
      auVar72._8_8_ = in_XMM2_Qb;
      auVar79._0_8_ = (double)(long)local_90._0_8_;
      auVar79._8_8_ = in_XMM2_Qb;
      auVar68 = vfmadd132sd_fma(auVar79,auVar72,ZEXT816(0x412e848000000000));
      pgStack_c0 = (gen_ctx *)0x177bd7;
      fprintf(pFVar3,"C2MIR compiler end                -- %.0f usec\n",auVar68._0_8_ - local_b8);
    }
    return (uint)(pcVar44->n_errors == 0);
  }
LAB_00177efb:
  pgStack_c0 = (gen_ctx *)0x177f03;
  c2mir_compile_cold_6();
  pcVar64 = (char *)type;
  type = (node *)ops;
LAB_00177f03:
  pgStack_c0 = (gen_ctx *)0x177f08;
  c2mir_compile_cold_1();
LAB_00177f08:
  pgStack_c0 = (gen_ctx *)0x177f0d;
  c2mir_compile_cold_5();
LAB_00177f0d:
  pgStack_c0 = (gen_ctx *)compile_finish;
  c2mir_compile_cold_4();
  pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->symbol_text;
  pcVar66 = (c2m_ctx_t)pcVar65;
  iVar10 = extraout_EAX;
  pcStack_e8 = pcVar44;
  pgStack_e0 = (gen_ctx *)type;
  ppStack_d8 = (pre_ctx *)ctx;
  pcStack_d0 = (c2m_ctx_t)__stream;
  pcStack_c8 = (c2m_ctx_t)n;
  pgStack_c0 = op3;
  if (pcVar13 != (c2m_ctx_t)0x0) {
    pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x177f41;
      free(pcVar44);
      pgStack_128 = (gen_ctx *)0x177f49;
      free(pcVar13);
      ((c2m_ctx_t)pcVar65)->symbol_text = (VARR_char *)0x0;
      pcVar66 = pcVar13;
      iVar10 = extraout_EAX_00;
      goto LAB_00177f54;
    }
LAB_001788c4:
    pgStack_128 = (gen_ctx *)0x1788c9;
    compile_finish_cold_1();
LAB_001788c9:
    pgStack_128 = (gen_ctx *)0x1788ce;
    compile_finish_cold_2();
LAB_001788ce:
    pgStack_128 = (gen_ctx *)0x1788d3;
    compile_finish_cold_3();
LAB_001788d3:
    pgStack_128 = (gen_ctx *)0x1788d8;
    compile_finish_cold_40();
LAB_001788d8:
    pgStack_128 = (gen_ctx *)0x1788dd;
    compile_finish_cold_41();
LAB_001788dd:
    pgStack_128 = (gen_ctx *)0x1788e2;
    compile_finish_cold_42();
LAB_001788e2:
    pgStack_128 = (gen_ctx *)0x1788e7;
    compile_finish_cold_43();
    goto LAB_001788e7;
  }
LAB_00177f54:
  pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->temp_string;
  if (pcVar13 != (c2m_ctx_t)0x0) {
    pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x177f72;
      free(pcVar44);
      pgStack_128 = (gen_ctx *)0x177f7a;
      free(pcVar13);
      ((c2m_ctx_t)pcVar65)->temp_string = (VARR_char *)0x0;
      pcVar66 = pcVar13;
      iVar10 = extraout_EAX_01;
      goto LAB_00177f85;
    }
    goto LAB_001788c9;
  }
LAB_00177f85:
  pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->node_positions;
  if (pcVar13 != (c2m_ctx_t)0x0) {
    pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x177fa3;
      free(pcVar44);
      pgStack_128 = (gen_ctx *)0x177fab;
      free(pcVar13);
      ((c2m_ctx_t)pcVar65)->node_positions = (VARR_pos_t *)0x0;
      pcVar66 = pcVar13;
      iVar10 = extraout_EAX_02;
      goto LAB_00177fb6;
    }
    goto LAB_001788ce;
  }
LAB_00177fb6:
  if (((c2m_ctx_t)pcVar65)->parse_ctx == (parse_ctx *)0x0) goto LAB_001784fb;
  pcVar44 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->recorded_tokens;
  if (pcVar44 != (c2m_ctx_t)0x0) {
    pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x177fe2;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x177fea;
      free(pcVar44);
      ((c2m_ctx_t)pcVar65)->recorded_tokens = (VARR_token_t *)0x0;
      pcVar66 = pcVar44;
      goto LAB_00177ff5;
    }
    goto LAB_001788f6;
  }
LAB_00177ff5:
  pcVar44 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->buffered_tokens;
  if (pcVar44 != (c2m_ctx_t)0x0) {
    pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x178013;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x17801b;
      pcVar66 = pcVar44;
      free(pcVar44);
      ((c2m_ctx_t)pcVar65)->buffered_tokens = (VARR_token_t *)0x0;
      goto LAB_00178026;
    }
    goto LAB_001788fb;
  }
LAB_00178026:
  type = (node *)((c2m_ctx_t)pcVar65)->pre_ctx;
  if ((gen_ctx *)type == (gen_ctx *)0x0) {
LAB_00178351:
    n = (node *)((c2m_ctx_t)pcVar65)->parse_ctx;
    type = (node *)((c2m_ctx_t)n)->env[0].__jmpbuf[2];
    if ((gen_ctx *)type == (gen_ctx *)0x0) {
LAB_0017847a:
      if (((c2m_ctx_t)pcVar65)->eof_s != (stream_t)0x0) {
        pgStack_128 = (gen_ctx *)0x17848b;
        free_stream(((c2m_ctx_t)pcVar65)->eof_s);
      }
      pcVar44 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->streams;
      if (pcVar44 != (c2m_ctx_t)0x0) {
LAB_00178497:
        pMVar15 = pcVar44->ctx;
        pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
        if (pMVar15 != (MIR_context_t)0x0) {
          if (pcVar66 != (c2m_ctx_t)0x0) goto code_r0x001784ac;
          pgStack_128 = (gen_ctx *)0x178892;
          compile_finish_cold_28();
          pcVar13 = pcVar44;
LAB_00178892:
          pcVar44 = pcVar13;
          pgStack_128 = (gen_ctx *)0x178897;
          compile_finish_cold_12();
LAB_00178897:
          pgStack_128 = (gen_ctx *)0x17889c;
          compile_finish_cold_21();
LAB_0017889c:
          pgStack_128 = (gen_ctx *)0x1788a1;
          compile_finish_cold_10();
LAB_001788a1:
          pgStack_128 = (gen_ctx *)0x1788a6;
          compile_finish_cold_9();
          goto LAB_001788a6;
        }
        goto LAB_001784ce;
      }
      goto LAB_001784ef;
    }
    if (((gen_ctx *)type)->to_free == (VARR_void_ptr_t *)0x0) {
LAB_00178404:
      type = (node *)((c2m_ctx_t)n)->env[0].__jmpbuf[2];
      pcVar44 = *(c2m_ctx_t *)&((gen_ctx *)type)->addr_insn_p;
      pcVar13 = pcVar44;
      if ((pcVar44 == (c2m_ctx_t)0x0) ||
         (pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0], pcVar66 == (c2m_ctx_t)0x0))
      goto LAB_001788b5;
      pgStack_128 = (gen_ctx *)0x178428;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x178430;
      free(pcVar44);
      *(char **)&((gen_ctx *)type)->addr_insn_p = (char *)0x0;
      type = (node *)((c2m_ctx_t)n)->env[0].__jmpbuf[2];
      pcVar13 = (c2m_ctx_t)((gen_ctx *)type)->tied_regs;
      if ((pcVar13 != (c2m_ctx_t)0x0) &&
         (pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0], pcVar44 != (c2m_ctx_t)0x0)) {
        pgStack_128 = (gen_ctx *)0x17845d;
        free(pcVar44);
        pgStack_128 = (gen_ctx *)0x178465;
        free(pcVar13);
        ((gen_ctx *)type)->tied_regs = (bitmap_t)0x0;
        pgStack_128 = (gen_ctx *)0x178476;
        free((void *)((c2m_ctx_t)n)->env[0].__jmpbuf[2]);
        ((c2m_ctx_t)n)->env[0].__jmpbuf[2] = 0;
        goto LAB_0017847a;
      }
      goto LAB_001788bf;
    }
    if (*(char **)&((gen_ctx *)type)->addr_insn_p == (char *)0x0) goto LAB_00178932;
    if (((gen_ctx *)type)->optimize_level != 0) {
      pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->curr_func_item;
      ctx = (MIR_context_t)(*(long *)(*(char **)&((gen_ctx *)type)->addr_insn_p + 0x10) + 8);
      op3 = (gen_ctx *)0x0;
      do {
        if (*(int *)((long)ctx + -8) != 0) {
          uStack_110 = *(undefined8 *)((long)ctx + 0x10);
          uStack_120 = ctx->gen_ctx;
          uStack_118 = *(undefined8 *)((long)ctx + 8);
          pgStack_128 = (gen_ctx *)0x1783b9;
          pcVar66 = pcVar44;
          (*(code *)((gen_ctx *)type)->to_free)();
        }
        op3 = (gen_ctx *)((long)&op3->ctx + 1);
        ctx = (MIR_context_t)((long)ctx + 0x20);
      } while (op3 < (gen_ctx *)(ulong)((gen_ctx *)type)->optimize_level);
    }
    ((gen_ctx *)type)->optimize_level = 0;
    ((gen_ctx *)type)->ctx = (MIR_context_t)0x0;
    pVVar6 = ((gen_ctx *)type)->tied_regs;
    if (pVVar6 != (bitmap_t)0x0) {
      pcVar17 = (char *)pVVar6->els_num;
      if ((int)pcVar17 != 0) {
        pcVar66 = (c2m_ctx_t)pVVar6->varr;
        pcVar64 = (char *)0xff;
        pgStack_128 = (gen_ctx *)0x178404;
        memset(pcVar66,0xff,((ulong)pcVar17 & 0xffffffff) << 2);
      }
      goto LAB_00178404;
    }
    goto LAB_00178937;
  }
  pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->ctx;
  if (pcVar44 != (c2m_ctx_t)0x0) {
    pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x178051;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x178059;
      free(pcVar44);
      ((gen_ctx *)type)->ctx = (MIR_context_t)0x0;
      pcVar66 = pcVar44;
      goto LAB_00178061;
    }
    goto LAB_00178919;
  }
LAB_00178061:
  pcVar44 = *(c2m_ctx_t *)&((gen_ctx *)type)->optimize_level;
  if (pcVar44 != (c2m_ctx_t)0x0) {
    pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x17807d;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x178085;
      free(pcVar44);
      *(char **)&((gen_ctx *)type)->optimize_level = (char *)0x0;
      pcVar66 = pcVar44;
      goto LAB_0017808e;
    }
    goto LAB_0017891e;
  }
LAB_0017808e:
  pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->func_used_hard_regs;
  if (pcVar44 != (c2m_ctx_t)0x0) {
    pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x1780ad;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x1780b5;
      free(pcVar44);
      ((gen_ctx *)type)->func_used_hard_regs = (bitmap_t)0x0;
      pcVar66 = pcVar44;
      goto LAB_001780c1;
    }
    goto LAB_00178923;
  }
LAB_001780c1:
  ctx = (MIR_context_t)((c2m_ctx_t)pcVar65)->pre_ctx;
  pcVar13 = (c2m_ctx_t)((pre_ctx *)ctx)->macros;
  if (pcVar13 != (c2m_ctx_t)0x0) {
    do {
      pMVar15 = pcVar13->ctx;
      pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
      if (pMVar15 == (MIR_context_t)0x0) goto LAB_0017816a;
      pcVar66 = pcVar44;
      if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_00178892;
      pcVar17 = (char *)((long)&pMVar15[-1].wrapper_end_addr + 7);
      pcVar13->ctx = (MIR_context_t)pcVar17;
      pcVar44 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[(long)((long)&pMVar15[-1].wrapper_end_addr + 5)]
      ;
      n = (node *)pcVar44->options;
      if ((c2m_ctx_t)n != (c2m_ctx_t)0x0) {
        pcVar66 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[0];
        if (pcVar66 == (c2m_ctx_t)0x0) goto LAB_001788a1;
        pgStack_128 = (gen_ctx *)0x178115;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x17811d;
        free(n);
        pcVar44->options = (c2mir_options *)0x0;
      }
      n = (node *)pcVar44->env[0].__jmpbuf[0];
      if ((c2m_ctx_t)n != (c2m_ctx_t)0x0) {
        pcVar66 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[0];
        if (pcVar66 == (c2m_ctx_t)0x0) goto LAB_0017889c;
        pgStack_128 = (gen_ctx *)0x178140;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x178148;
        free(n);
        pcVar44->env[0].__jmpbuf[0] = 0;
      }
      pgStack_128 = (gen_ctx *)0x178158;
      free(pcVar44);
      pcVar13 = (c2m_ctx_t)((pre_ctx *)ctx)->macros;
    } while (pcVar13 != (c2m_ctx_t)0x0);
    pgStack_128 = (gen_ctx *)0x17816a;
    compile_finish_cold_11();
LAB_0017816a:
    pcVar66 = pcVar44;
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x178178;
      free(pcVar44);
      pgStack_128 = (gen_ctx *)0x178180;
      pcVar66 = pcVar13;
      free(pcVar13);
      ((pre_ctx *)ctx)->macros = (VARR_macro_t *)0x0;
      goto LAB_00178188;
    }
    goto LAB_00178941;
  }
LAB_00178188:
  n = (node *)((pre_ctx *)ctx)->macro_tab;
  if ((c2m_ctx_t)n == (c2m_ctx_t)0x0) {
LAB_00178294:
    pcVar44 = *(c2m_ctx_t *)&((gen_ctx *)type)->debug_level;
    if (pcVar44 != (c2m_ctx_t)0x0) {
      do {
        if (pcVar44->ctx == (MIR_context_t)0x0) goto LAB_001782bb;
        pgStack_128 = (gen_ctx *)0x1782ac;
        pop_ifstate((c2m_ctx_t)pcVar65);
        pcVar44 = *(c2m_ctx_t *)&((gen_ctx *)type)->debug_level;
      } while (pcVar44 != (c2m_ctx_t)0x0);
      pgStack_128 = (gen_ctx *)0x1782bb;
      compile_finish_cold_18();
LAB_001782bb:
      pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
      if (pcVar66 != (c2m_ctx_t)0x0) {
        pgStack_128 = (gen_ctx *)0x1782cd;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x1782d5;
        free(pcVar44);
        *(char **)&((gen_ctx *)type)->debug_level = (char *)0x0;
        goto LAB_001782de;
      }
      goto LAB_0017893c;
    }
LAB_001782de:
    pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->curr_cfg;
    if (pcVar44 == (c2m_ctx_t)0x0) {
LAB_00178345:
      pcVar66 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->pre_ctx;
      pgStack_128 = (gen_ctx *)0x178351;
      free(pcVar66);
      goto LAB_00178351;
    }
    do {
      pMVar15 = pcVar44->ctx;
      pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
      if (pMVar15 == (MIR_context_t)0x0) goto LAB_00178323;
      if (pcVar66 == (c2m_ctx_t)0x0) goto LAB_00178897;
      pcVar17 = (char *)((long)&pMVar15[-1].wrapper_end_addr + 7);
      pcVar44->ctx = (MIR_context_t)pcVar17;
      pcVar66 = (c2m_ctx_t)pcVar66->env[0].__jmpbuf[(long)((long)&pMVar15[-1].wrapper_end_addr + 5)]
      ;
      pgStack_128 = (gen_ctx *)0x178311;
      free_macro_call((macro_call_t)pcVar66);
      pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->curr_cfg;
    } while (pcVar44 != (c2m_ctx_t)0x0);
    pgStack_128 = (gen_ctx *)0x178323;
    compile_finish_cold_20();
LAB_00178323:
    if (pcVar66 != (c2m_ctx_t)0x0) {
      pgStack_128 = (gen_ctx *)0x178331;
      free(pcVar66);
      pgStack_128 = (gen_ctx *)0x178339;
      free(pcVar44);
      ((gen_ctx *)type)->curr_cfg = (func_cfg_t)0x0;
      goto LAB_00178345;
    }
    goto LAB_00178946;
  }
  if (((c2m_ctx_t)n)->env[0].__jmpbuf[3] == 0) {
LAB_00178222:
    n = (node *)((pre_ctx *)ctx)->macro_tab;
    pcVar44 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[4];
    pcVar13 = pcVar44;
    if ((pcVar44 == (c2m_ctx_t)0x0) ||
       (pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0], pcVar66 == (c2m_ctx_t)0x0))
    goto LAB_001788ec;
    pgStack_128 = (gen_ctx *)0x178245;
    free(pcVar66);
    pgStack_128 = (gen_ctx *)0x17824d;
    free(pcVar44);
    ((c2m_ctx_t)n)->env[0].__jmpbuf[4] = 0;
    n = (node *)((pre_ctx *)ctx)->macro_tab;
    pcVar13 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[5];
    if ((pcVar13 != (c2m_ctx_t)0x0) &&
       (pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0], pcVar44 != (c2m_ctx_t)0x0)) {
      pgStack_128 = (gen_ctx *)0x178278;
      free(pcVar44);
      pgStack_128 = (gen_ctx *)0x178280;
      free(pcVar13);
      ((c2m_ctx_t)n)->env[0].__jmpbuf[5] = 0;
      pgStack_128 = (gen_ctx *)0x178290;
      free(((pre_ctx *)ctx)->macro_tab);
      ((pre_ctx *)ctx)->macro_tab = (HTAB_macro_t *)0x0;
      goto LAB_00178294;
    }
    goto LAB_001788f1;
  }
  lVar4 = ((c2m_ctx_t)n)->env[0].__jmpbuf[4];
  if (lVar4 == 0) goto LAB_0017894b;
  if (*(int *)&((c2m_ctx_t)n)->options != 0) {
    pcVar17 = (char *)((c2m_ctx_t)n)->env[0].__jmpbuf[0];
    op3 = (gen_ctx *)(*(long *)(lVar4 + 0x10) + 8);
    pcVar13 = (c2m_ctx_t)0x0;
    pgStack_f0 = (gen_ctx *)pcVar17;
    do {
      if (*(int *)((long)op3 + -8) != 0) {
        pcVar66 = *(c2m_ctx_t *)op3;
        pgStack_128 = (gen_ctx *)0x1781db;
        pcVar64 = (char *)pgStack_f0;
        (*(code *)((c2m_ctx_t)n)->env[0].__jmpbuf[3])();
      }
      pcVar13 = (c2m_ctx_t)((long)&pcVar13->ctx + 1);
      op3 = (gen_ctx *)((long)op3 + 0x10);
    } while (pcVar13 < (c2m_ctx_t)(ulong)*(uint *)&((c2m_ctx_t)n)->options);
  }
  *(undefined4 *)&((c2m_ctx_t)n)->options = 0;
  ((c2m_ctx_t)n)->ctx = (MIR_context_t)0x0;
  puVar5 = (undefined8 *)((c2m_ctx_t)n)->env[0].__jmpbuf[5];
  if (puVar5 != (undefined8 *)0x0) {
    pcVar17 = (char *)*puVar5;
    if ((int)pcVar17 != 0) {
      pcVar66 = (c2m_ctx_t)puVar5[2];
      pcVar64 = (char *)0xff;
      pgStack_128 = (gen_ctx *)0x178222;
      memset(pcVar66,0xff,((ulong)pcVar17 & 0xffffffff) << 2);
    }
    goto LAB_00178222;
  }
  goto LAB_00178950;
code_r0x001784ac:
  pcVar17 = (char *)((long)&pMVar15[-1].wrapper_end_addr + 7);
  pcVar44->ctx = (MIR_context_t)pcVar17;
  pcVar66 = (c2m_ctx_t)pcVar66->env[0].__jmpbuf[(long)((long)&pMVar15[-1].wrapper_end_addr + 5)];
  pgStack_128 = (gen_ctx *)0x1784bd;
  free_stream((stream_t)pcVar66);
  pcVar44 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->streams;
  if (pcVar44 == (c2m_ctx_t)0x0) goto code_r0x001784c9;
  goto LAB_00178497;
LAB_0017a36f:
  compile_init_cold_19();
LAB_0017a374:
  compile_init_cold_17();
LAB_0017a379:
  compile_init_cold_15();
LAB_0017a37e:
  compile_init_cold_7();
LAB_0017a383:
  compile_init_cold_2();
LAB_0017a388:
  compile_init_cold_1();
LAB_0017a38d:
  compile_init_cold_6();
LAB_0017a392:
  compile_init_cold_5();
  goto LAB_0017a397;
LAB_0017a360:
  compile_init_cold_4();
  goto LAB_0017a365;
code_r0x001784c9:
  pgStack_128 = (gen_ctx *)0x1784ce;
  compile_finish_cold_27();
LAB_001784ce:
  if (pcVar66 == (c2m_ctx_t)0x0) {
LAB_00178914:
    pgStack_128 = (gen_ctx *)0x178919;
    compile_finish_cold_29();
LAB_00178919:
    pgStack_128 = (gen_ctx *)0x17891e;
    compile_finish_cold_6();
LAB_0017891e:
    pgStack_128 = (gen_ctx *)0x178923;
    compile_finish_cold_7();
LAB_00178923:
    pgStack_128 = (gen_ctx *)0x178928;
    compile_finish_cold_8();
LAB_00178928:
    pgStack_128 = (gen_ctx *)0x17892d;
    compile_finish_cold_33();
  }
  else {
    pgStack_128 = (gen_ctx *)0x1784dc;
    free(pcVar66);
    pgStack_128 = (gen_ctx *)0x1784e4;
    free(pcVar44);
    ((c2m_ctx_t)pcVar65)->streams = (VARR_stream_t *)0x0;
LAB_001784ef:
    pcVar66 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->parse_ctx;
    pgStack_128 = (gen_ctx *)0x1784fb;
    free(pcVar66);
    iVar10 = extraout_EAX_03;
LAB_001784fb:
    n = (node *)((c2m_ctx_t)pcVar65)->check_ctx;
    if ((c2m_ctx_t)n == (c2m_ctx_t)0x0) {
LAB_00178789:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->headers;
      if (pcVar13 != (c2m_ctx_t)0x0) {
        pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
        if (pcVar44 != (c2m_ctx_t)0x0) {
          pgStack_128 = (gen_ctx *)0x1787a7;
          free(pcVar44);
          pgStack_128 = (gen_ctx *)0x1787af;
          free(pcVar13);
          ((c2m_ctx_t)pcVar65)->headers = (VARR_char_ptr_t *)0x0;
          iVar10 = extraout_EAX_05;
          goto LAB_001787ba;
        }
        goto LAB_001788d3;
      }
LAB_001787ba:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->system_headers;
      if (pcVar13 != (c2m_ctx_t)0x0) {
        pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
        if (pcVar44 != (c2m_ctx_t)0x0) {
          pgStack_128 = (gen_ctx *)0x1787d8;
          free(pcVar44);
          pgStack_128 = (gen_ctx *)0x1787e0;
          free(pcVar13);
          ((c2m_ctx_t)pcVar65)->system_headers = (VARR_char_ptr_t *)0x0;
          iVar10 = extraout_EAX_06;
          goto LAB_001787eb;
        }
        goto LAB_001788d8;
      }
LAB_001787eb:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->call_nodes;
      if (pcVar13 != (c2m_ctx_t)0x0) {
        pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
        if (pcVar44 != (c2m_ctx_t)0x0) {
          pgStack_128 = (gen_ctx *)0x178809;
          free(pcVar44);
          pgStack_128 = (gen_ctx *)0x178811;
          free(pcVar13);
          ((c2m_ctx_t)pcVar65)->call_nodes = (VARR_node_t *)0x0;
          iVar10 = extraout_EAX_07;
          goto LAB_0017881c;
        }
        goto LAB_001788dd;
      }
LAB_0017881c:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->containing_anon_members;
      if (pcVar13 != (c2m_ctx_t)0x0) {
        pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
        if (pcVar44 != (c2m_ctx_t)0x0) {
          pgStack_128 = (gen_ctx *)0x17883a;
          free(pcVar44);
          pgStack_128 = (gen_ctx *)0x178842;
          free(pcVar13);
          ((c2m_ctx_t)pcVar65)->containing_anon_members = (VARR_node_t *)0x0;
          iVar10 = extraout_EAX_08;
          goto LAB_0017884d;
        }
        goto LAB_001788e2;
      }
LAB_0017884d:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)pcVar65)->init_object_path;
      if (pcVar13 == (c2m_ctx_t)0x0) {
        return iVar10;
      }
      pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0];
      if (pcVar44 != (c2m_ctx_t)0x0) {
        pgStack_128 = (gen_ctx *)0x17886b;
        free(pcVar44);
        pgStack_128 = (gen_ctx *)0x178873;
        free(pcVar13);
        ((c2m_ctx_t)pcVar65)->init_object_path = (VARR_init_object_t *)0x0;
        return extraout_EAX_09;
      }
LAB_001788e7:
      pgStack_128 = (gen_ctx *)0x1788ec;
      compile_finish_cold_44();
      pcVar66 = pcVar44;
LAB_001788ec:
      pcVar44 = pcVar66;
      pgStack_128 = (gen_ctx *)0x1788f1;
      compile_finish_cold_17();
LAB_001788f1:
      pgStack_128 = (gen_ctx *)0x1788f6;
      compile_finish_cold_16();
      pcVar66 = pcVar44;
      pcVar44 = pcVar13;
LAB_001788f6:
      pgStack_128 = (gen_ctx *)0x1788fb;
      compile_finish_cold_4();
LAB_001788fb:
      pgStack_128 = (gen_ctx *)0x178900;
      compile_finish_cold_5();
LAB_00178900:
      pgStack_128 = (gen_ctx *)0x178905;
      compile_finish_cold_30();
LAB_00178905:
      pgStack_128 = (gen_ctx *)0x17890a;
      compile_finish_cold_31();
LAB_0017890a:
      pgStack_128 = (gen_ctx *)0x17890f;
      compile_finish_cold_38();
LAB_0017890f:
      pgStack_128 = (gen_ctx *)0x178914;
      compile_finish_cold_39();
      goto LAB_00178914;
    }
    pcVar44 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__saved_mask.__val[3];
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
      if (pcVar66 != (c2m_ctx_t)0x0) {
        pgStack_128 = (gen_ctx *)0x178526;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x17852e;
        free(pcVar44);
        ((c2m_ctx_t)n)->env[0].__saved_mask.__val[3] = 0;
        pcVar66 = pcVar44;
        goto LAB_00178536;
      }
      goto LAB_00178900;
    }
LAB_00178536:
    pcVar44 = (c2m_ctx_t)((c2m_ctx_t)n)->options;
    if (pcVar44 != (c2m_ctx_t)0x0) {
      pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
      if (pcVar66 != (c2m_ctx_t)0x0) {
        pgStack_128 = (gen_ctx *)0x178551;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x178559;
        pcVar66 = pcVar44;
        free(pcVar44);
        ((c2m_ctx_t)n)->options = (c2mir_options *)0x0;
        goto LAB_00178561;
      }
      goto LAB_00178905;
    }
LAB_00178561:
    type = (node *)((c2m_ctx_t)pcVar65)->symbol_tab;
    if ((gen_ctx *)type == (gen_ctx *)0x0) {
LAB_00178698:
      pcVar13 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[7];
      if (pcVar13 != (c2m_ctx_t)0x0) {
        if (pcVar13->env[0].__jmpbuf[3] != 0) {
          pgStack_128 = (gen_ctx *)0x1786b1;
          HTAB_case_t_clear((HTAB_case_t *)pcVar13);
        }
        type = (node *)((c2m_ctx_t)n)->env[0].__jmpbuf[7];
        pcVar44 = *(c2m_ctx_t *)&((gen_ctx *)type)->addr_insn_p;
        if ((pcVar44 == (c2m_ctx_t)0x0) ||
           (pcVar13 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0], pcVar13 == (c2m_ctx_t)0x0))
        goto LAB_001788b0;
        pgStack_128 = (gen_ctx *)0x1786d5;
        free(pcVar13);
        pgStack_128 = (gen_ctx *)0x1786dd;
        free(pcVar44);
        *(char **)&((gen_ctx *)type)->addr_insn_p = (char *)0x0;
        type = (node *)((c2m_ctx_t)n)->env[0].__jmpbuf[7];
        pcVar13 = (c2m_ctx_t)((gen_ctx *)type)->tied_regs;
        if ((pcVar13 == (c2m_ctx_t)0x0) ||
           (pcVar44 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0], pcVar44 == (c2m_ctx_t)0x0))
        goto LAB_001788ba;
        pgStack_128 = (gen_ctx *)0x17870a;
        free(pcVar44);
        pgStack_128 = (gen_ctx *)0x178712;
        free(pcVar13);
        ((gen_ctx *)type)->tied_regs = (bitmap_t)0x0;
        pgStack_128 = (gen_ctx *)0x178723;
        free((void *)((c2m_ctx_t)n)->env[0].__jmpbuf[7]);
        ((c2m_ctx_t)n)->env[0].__jmpbuf[7] = 0;
      }
      pcVar44 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[4];
      if (pcVar44 != (c2m_ctx_t)0x0) {
        pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
        if (pcVar66 != (c2m_ctx_t)0x0) {
          pgStack_128 = (gen_ctx *)0x178742;
          free(pcVar66);
          pgStack_128 = (gen_ctx *)0x17874a;
          free(pcVar44);
          ((c2m_ctx_t)n)->env[0].__jmpbuf[4] = 0;
          goto LAB_00178752;
        }
        goto LAB_0017890a;
      }
LAB_00178752:
      pcVar44 = (c2m_ctx_t)((c2m_ctx_t)n)->env[0].__jmpbuf[5];
      if (pcVar44 == (c2m_ctx_t)0x0) {
LAB_0017877d:
        pgStack_128 = (gen_ctx *)0x178789;
        free(((c2m_ctx_t)pcVar65)->check_ctx);
        iVar10 = extraout_EAX_04;
        goto LAB_00178789;
      }
      pcVar66 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0];
      if (pcVar66 != (c2m_ctx_t)0x0) {
        pgStack_128 = (gen_ctx *)0x17876d;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x178775;
        free(pcVar44);
        ((c2m_ctx_t)n)->env[0].__jmpbuf[5] = 0;
        goto LAB_0017877d;
      }
      goto LAB_0017890f;
    }
    if (((gen_ctx *)type)->to_free == (VARR_void_ptr_t *)0x0) {
LAB_00178616:
      type = (node *)((c2m_ctx_t)pcVar65)->symbol_tab;
      pcVar13 = *(c2m_ctx_t *)&((gen_ctx *)type)->addr_insn_p;
      pcVar44 = pcVar13;
      if ((pcVar13 == (c2m_ctx_t)0x0) ||
         (pcVar66 = (c2m_ctx_t)pcVar13->env[0].__jmpbuf[0], pcVar66 == (c2m_ctx_t)0x0)) {
LAB_001788a6:
        pcVar13 = pcVar66;
        pgStack_128 = (gen_ctx *)0x1788ab;
        compile_finish_cold_35();
      }
      else {
        pgStack_128 = (gen_ctx *)0x17863d;
        free(pcVar66);
        pgStack_128 = (gen_ctx *)0x178645;
        free(pcVar13);
        *(char **)&((gen_ctx *)type)->addr_insn_p = (char *)0x0;
        type = (node *)((c2m_ctx_t)pcVar65)->symbol_tab;
        pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->tied_regs;
        if ((pcVar44 != (c2m_ctx_t)0x0) &&
           (pcVar13 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[0], pcVar13 != (c2m_ctx_t)0x0)) {
          pgStack_128 = (gen_ctx *)0x178675;
          free(pcVar13);
          pgStack_128 = (gen_ctx *)0x17867d;
          free(pcVar44);
          ((gen_ctx *)type)->tied_regs = (bitmap_t)0x0;
          pgStack_128 = (gen_ctx *)0x178691;
          free(((c2m_ctx_t)pcVar65)->symbol_tab);
          ((c2m_ctx_t)pcVar65)->symbol_tab = (HTAB_symbol_t *)0x0;
          goto LAB_00178698;
        }
      }
      pgStack_128 = (gen_ctx *)0x1788b0;
      compile_finish_cold_34();
LAB_001788b0:
      pgStack_128 = (gen_ctx *)0x1788b5;
      compile_finish_cold_37();
      pcVar66 = pcVar13;
      pcVar13 = pcVar44;
LAB_001788b5:
      pcVar44 = pcVar66;
      pgStack_128 = (gen_ctx *)0x1788ba;
      compile_finish_cold_26();
LAB_001788ba:
      pgStack_128 = (gen_ctx *)0x1788bf;
      compile_finish_cold_36();
LAB_001788bf:
      pgStack_128 = (gen_ctx *)0x1788c4;
      compile_finish_cold_25();
      goto LAB_001788c4;
    }
    if (*(char **)&((gen_ctx *)type)->addr_insn_p == (char *)0x0) goto LAB_00178928;
    if (((gen_ctx *)type)->optimize_level != 0) {
      pcVar44 = (c2m_ctx_t)((gen_ctx *)type)->curr_func_item;
      ctx = (MIR_context_t)(*(long *)(*(char **)&((gen_ctx *)type)->addr_insn_p + 0x10) + 8);
      op3 = (gen_ctx *)0x0;
      do {
        if (*(int *)((long)ctx + -8) != 0) {
          uStack_120 = ctx->gen_ctx;
          uStack_118 = *(undefined8 *)((long)ctx + 8);
          uStack_110 = *(undefined8 *)((long)ctx + 0x10);
          uStack_108 = *(undefined8 *)((long)ctx + 0x18);
          uStack_100 = *(undefined8 *)((long)ctx + 0x20);
          uStack_f8 = *(undefined8 *)((long)ctx + 0x28);
          pgStack_128 = (gen_ctx *)0x1785cb;
          pcVar66 = pcVar44;
          (*(code *)((gen_ctx *)type)->to_free)();
        }
        op3 = (gen_ctx *)((long)&op3->ctx + 1);
        ctx = (MIR_context_t)((long)ctx + 0x38);
      } while (op3 < (gen_ctx *)(ulong)((gen_ctx *)type)->optimize_level);
    }
    ((gen_ctx *)type)->optimize_level = 0;
    ((gen_ctx *)type)->ctx = (MIR_context_t)0x0;
    pVVar6 = ((gen_ctx *)type)->tied_regs;
    if (pVVar6 != (bitmap_t)0x0) {
      pcVar17 = (char *)pVVar6->els_num;
      if ((int)pcVar17 != 0) {
        pcVar66 = (c2m_ctx_t)pVVar6->varr;
        pcVar64 = (char *)0xff;
        pgStack_128 = (gen_ctx *)0x178616;
        memset(pcVar66,0xff,((ulong)pcVar17 & 0xffffffff) << 2);
      }
      goto LAB_00178616;
    }
  }
  pgStack_128 = (gen_ctx *)0x178932;
  compile_finish_cold_32();
LAB_00178932:
  pgStack_128 = (gen_ctx *)0x178937;
  compile_finish_cold_24();
LAB_00178937:
  pgStack_128 = (gen_ctx *)0x17893c;
  compile_finish_cold_23();
LAB_0017893c:
  pgStack_128 = (gen_ctx *)0x178941;
  compile_finish_cold_19();
  pcVar13 = pcVar44;
LAB_00178941:
  pcVar44 = pcVar13;
  pgStack_128 = (gen_ctx *)0x178946;
  compile_finish_cold_13();
LAB_00178946:
  pgStack_128 = (gen_ctx *)0x17894b;
  compile_finish_cold_22();
  pcVar13 = pcVar44;
LAB_0017894b:
  pgStack_128 = (gen_ctx *)0x178950;
  compile_finish_cold_15();
LAB_00178950:
  pgStack_128 = (gen_ctx *)compile_init;
  compile_finish_cold_14();
  pcVar66->options = (c2mir_options *)pcVar64;
  pcVar66->n_errors = 0;
  pcVar66->n_warnings = 0;
  pcVar66->c_getc = extraout_RDX;
  pcVar66->c_getc_data = pcVar17;
  pptVar67 = (token_t *)&DAT_00000018;
  pcStack_150 = (c2m_ctx_t)pcVar65;
  pgStack_148 = (gen_ctx *)type;
  ppStack_140 = (pre_ctx *)ctx;
  pcStack_138 = pcVar13;
  pcStack_130 = (c2m_ctx_t)n;
  pgStack_128 = op3;
  pVVar16 = (VARR_char *)malloc(0x18);
  pcVar66->symbol_text = pVVar16;
  if (pVVar16 == (VARR_char *)0x0) goto LAB_0017a365;
  pVVar16->els_num = 0;
  pVVar16->size = 0x80;
  pcVar17 = (char *)malloc(0x80);
  pVVar16->varr = pcVar17;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar16 = (VARR_char *)malloc(0x18);
  pcVar66->temp_string = pVVar16;
  if (pVVar16 == (VARR_char *)0x0) goto LAB_0017a365;
  pVVar16->els_num = 0;
  pVVar16->size = 0x80;
  pcVar17 = (char *)malloc(0x80);
  pVVar16->varr = pcVar17;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar18 = (VARR_pos_t *)malloc(0x18);
  pcVar66->node_positions = pVVar18;
  if (pVVar18 == (VARR_pos_t *)0x0) goto LAB_0017a365;
  pVVar18->els_num = 0;
  pVVar18->size = 0x80;
  ppVar19 = (pos_t *)malloc(0x800);
  pVVar18->varr = ppVar19;
  ppVar20 = (parse_ctx *)c2mir_calloc(pcVar66,0x28);
  pcVar66->parse_ctx = ppVar20;
  ppVar20->curr_scope = (node_t_conflict)0x0;
  pcVar66->error_func = fatal_error;
  ppVar20->record_level = 0;
  pcVar66->curr_uid = 0;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar21 = (VARR_stream_t *)malloc(0x18);
  pcVar66->cs = (stream_t)0x0;
  pcVar66->eof_s = (stream_t)0x0;
  pcVar66->streams = pVVar21;
  if (pVVar21 == (VARR_stream_t *)0x0) goto LAB_0017a365;
  pVVar21->els_num = 0;
  pVVar21->size = 0x20;
  ppsVar22 = (stream_t *)malloc(0x100);
  pVVar21->varr = ppsVar22;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar23 = (VARR_token_t *)malloc(0x18);
  pcVar66->recorded_tokens = pVVar23;
  if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar23->els_num = 0;
  pVVar23->size = 0x20;
  pptVar67 = (token_t *)malloc(0x100);
  pVVar23->varr = pptVar67;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar23 = (VARR_token_t *)malloc(0x18);
  pcVar66->buffered_tokens = pVVar23;
  if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar23->els_num = 0;
  pVVar23->size = 0x20;
  pptVar67 = (token_t *)malloc(0x100);
  pVVar23->varr = pptVar67;
  ppVar24 = (pre_ctx *)c2mir_calloc(pcVar66,0x140);
  pcVar66->pre_ctx = ppVar24;
  ppVar24->no_out_p = 0;
  ppVar24->skip_if_part_p = 0;
  pmStack_178 = (macro_t)time(&tStack_158);
  __tp = localtime_r((time_t *)&pmStack_178,&tStack_1b0);
  if (__tp == (tm *)0x0) {
    builtin_strncpy(ppVar24->date_str_repr,"\"Unknown date\"",0xf);
    __tp = (tm *)0x22656d6974206e;
    builtin_strncpy(ppVar24->time_str_repr,"\"Unknown time\"",0xf);
  }
  else {
    strftime(ppVar24->date_str_repr,0x32,"\"%b %d %Y\"",__tp);
    strftime(ppVar24->time_str_repr,0x32,"\"%H:%M:%S\"",__tp);
  }
  strcpy(ppVar24->date_str,ppVar24->date_str_repr + 1);
  sVar25 = strlen(ppVar24->date_str);
  ppVar24->date_str[sVar25 - 1] = '\0';
  pcVar44 = (c2m_ctx_t)(ppVar24->time_str_repr + 1);
  strcpy(ppVar24->time_str,(char *)pcVar44);
  sVar25 = strlen(ppVar24->time_str);
  ppVar24->date_str[sVar25 + 0x31] = '\0';
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar26 = (VARR_char_ptr_t *)malloc(0x18);
  ppVar24->once_include_files = pVVar26;
  if (pVVar26 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
  pVVar26->els_num = 0;
  pVVar26->size = 0x40;
  ppcVar27 = (char_ptr_t *)malloc(0x200);
  pVVar26->varr = ppcVar27;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar23 = (VARR_token_t *)malloc(0x18);
  ppVar24->temp_tokens = pVVar23;
  if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar23->els_num = 0;
  pVVar23->size = 0x80;
  pptVar67 = (token_t *)malloc(0x400);
  pVVar23->varr = pptVar67;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar23 = (VARR_token_t *)malloc(0x18);
  ppVar24->output_buffer = pVVar23;
  if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
  pVVar23->els_num = 0;
  pVVar23->size = 0x800;
  pptVar67 = (token_t *)malloc(0x4000);
  pVVar23->varr = pptVar67;
  ppVar7 = pcVar66->pre_ctx;
  pptVar67 = (token_t *)&DAT_00000018;
  pcStack_170 = pcVar66;
  pVVar28 = (VARR_macro_t *)malloc(0x18);
  ppVar7->macros = pVVar28;
  if (pVVar28 == (VARR_macro_t *)0x0) goto LAB_0017a365;
  pVVar28->els_num = 0;
  pVVar28->size = 0x800;
  ppmVar29 = (macro_t *)malloc(0x4000);
  pVVar28->varr = ppmVar29;
  pcVar13 = (c2m_ctx_t)0x40;
  pHVar30 = (HTAB_macro_t *)malloc(0x40);
  if (pHVar30 == (HTAB_macro_t *)0x0) goto LAB_0017a397;
  pptVar67 = (token_t *)&DAT_00000018;
  pVVar31 = (VARR_HTAB_EL_macro_t *)malloc(0x18);
  pHVar30->els = pVVar31;
  if (pVVar31 == (VARR_HTAB_EL_macro_t *)0x0) goto LAB_0017a365;
  pVVar31->els_num = 0;
  pVVar31->size = 0x800;
  pptVar67 = (token_t *)0x8000;
  pHVar32 = (HTAB_EL_macro_t *)malloc(0x8000);
  pVVar31->varr = pHVar32;
  if (pHVar32 == (HTAB_EL_macro_t *)0x0) {
    compile_init_cold_24();
LAB_0017a3a1:
    compile_init_cold_20();
LAB_0017a3a6:
    compile_init_cold_18();
LAB_0017a3ab:
    compile_init_cold_16();
LAB_0017a3b0:
    compile_init_cold_14();
LAB_0017a3b5:
    compile_init_cold_13();
LAB_0017a3ba:
    compile_init_cold_12();
LAB_0017a3bf:
    compile_init_cold_11();
LAB_0017a3c4:
    compile_init_cold_10();
LAB_0017a3c9:
    compile_init_cold_9();
LAB_0017a3ce:
    compile_init_cold_8();
  }
  else {
    pVVar31->size = 0x800;
    pVVar31->els_num = 0x800;
    pptVar67 = (token_t *)&DAT_00000018;
    pVVar33 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar30->entries = pVVar33;
    if (pVVar33 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
    pVVar33->els_num = 0;
    pVVar33->size = 0x1000;
    phVar34 = (htab_ind_t *)malloc(0x4000);
    pVVar33->varr = phVar34;
    pHVar30->arg = (void *)0x0;
    pHVar30->hash_func = macro_hash;
    pHVar30->eq_func = macro_eq;
    pHVar30->free_func = (_func_void_macro_t_void_ptr *)0x0;
    pHVar30->els_num = 0;
    pHVar30->els_start = 0;
    pHVar30->els_bound = 0;
    pHVar30->collisions = 0;
    iVar10 = 0x1000;
    do {
      pVVar33 = pHVar30->entries;
      pcVar13 = (c2m_ctx_t)pVVar33->varr;
      if (pcVar13 == (c2m_ctx_t)0x0) {
        compile_init_cold_23();
        goto LAB_0017a36f;
      }
      uVar35 = pVVar33->els_num + 1;
      if (pVVar33->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        phVar34 = (htab_ind_t *)realloc(pcVar13,sVar63 * 4);
        pVVar33->varr = phVar34;
        pVVar33->size = sVar63;
      }
      pcVar66 = pcStack_170;
      sVar63 = pVVar33->els_num;
      pVVar33->els_num = sVar63 + 1;
      pVVar33->varr[sVar63] = 0xffffffff;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    ppVar7->macro_tab = pHVar30;
    ptVar12 = new_id_token(pcStack_170,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__DATE__");
    new_macro(pcVar66,ptVar12,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__TIME__");
    new_macro(pcVar66,ptVar12,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__FILE__");
    new_macro(pcVar66,ptVar12,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__LINE__");
    new_macro(pcVar66,ptVar12,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    if (pcVar66->options->pedantic_p != 0) {
LAB_00179040:
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar36 = (VARR_ifstate_t *)malloc(0x18);
      ppVar24->ifs = pVVar36;
      if (pVVar36 == (VARR_ifstate_t *)0x0) {
LAB_0017a365:
        mir_varr_error((char *)pptVar67);
      }
      pVVar36->els_num = 0;
      pVVar36->size = 0x200;
      ppiVar37 = (ifstate_t *)malloc(0x1000);
      pVVar36->varr = ppiVar37;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar38 = (VARR_macro_call_t *)malloc(0x18);
      ppVar24->macro_call_stack = pVVar38;
      if (pVVar38 == (VARR_macro_call_t *)0x0) goto LAB_0017a365;
      pVVar38->els_num = 0;
      pVVar38->size = 0x200;
      ppmVar39 = (macro_call_t *)malloc(0x1000);
      pVVar38->varr = ppmVar39;
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Bool",6,0x110,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Complex",9,0x111,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Alignas",9,0x113,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Alignof",9,0x112,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Atomic",8,0x114,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Generic",9,0x115,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Noreturn",10,0x116,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Static_assert",0xf,0x117,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"_Thread_local",0xe,0x118,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"auto",5,0x11a,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"break",6,0x11b,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"case",5,0x11c,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"char",5,0x11d,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"const",6,0x11e,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"continue",9,0x11f,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"default",8,0x120,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"do",3,0x121,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"double",7,0x122,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"else",5,0x123,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"enum",5,0x124,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"extern",7,0x125,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"float",6,0x126,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"for",4,0x127,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"goto",5,0x128,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"if",3,0x129,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"inline",7,0x12a,3,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"int",4,299,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"long",5,300,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"register",9,0x12d,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"restrict",9,0x12e,2,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"return",7,0x12f,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"short",6,0x130,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"signed",7,0x131,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"sizeof",7,0x132,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"static",7,0x133,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"struct",7,0x134,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"switch",7,0x135,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"typedef",8,0x136,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"typeof",7,0x137,1,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"union",6,0x138,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"unsigned",9,0x139,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"void",5,0x13a,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"volatile",9,0x13b,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"while",6,0x13c,0,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"__restrict",0xb,0x12e,1,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"__restrict__",0xd,0x12e,1,1);
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"__inline",9,0x12a,1,1);
      __tp = (tm *)0xb;
      pcVar44 = pcVar66;
      str_add((tab_str_t *)&tStack_1b0,pcVar66,"__inline__",0xb,0x12a,1,1);
      ppVar20 = pcVar66->parse_ctx;
      pcVar13 = (c2m_ctx_t)0x40;
      pHVar40 = (HTAB_tpname_t *)malloc(0x40);
      if (pHVar40 == (HTAB_tpname_t *)0x0) goto LAB_0017a397;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar41 = (VARR_HTAB_EL_tpname_t *)malloc(0x18);
      pHVar40->els = pVVar41;
      if (pVVar41 == (VARR_HTAB_EL_tpname_t *)0x0) goto LAB_0017a365;
      pVVar41->els_num = 0;
      pVVar41->size = 0x400;
      pptVar67 = (token_t *)0x8000;
      pHVar42 = (HTAB_EL_tpname_t *)malloc(0x8000);
      pVVar41->varr = pHVar42;
      if (pHVar42 == (HTAB_EL_tpname_t *)0x0) goto LAB_0017a3a1;
      pVVar41->size = 0x400;
      pVVar41->els_num = 0x400;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar33 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar40->entries = pVVar33;
      if (pVVar33 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar33->els_num = 0;
      pVVar33->size = 0x800;
      phVar34 = (htab_ind_t *)malloc(0x2000);
      pVVar33->varr = phVar34;
      pHVar40->arg = (void *)0x0;
      pHVar40->hash_func = tpname_hash;
      pHVar40->eq_func = tpname_eq;
      pHVar40->free_func = (_func_void_tpname_t_void_ptr *)0x0;
      pHVar40->els_num = 0;
      pHVar40->els_start = 0;
      pHVar40->els_bound = 0;
      pHVar40->collisions = 0;
      iVar10 = 0x800;
      do {
        pVVar33 = pHVar40->entries;
        pcVar13 = (c2m_ctx_t)pVVar33->varr;
        if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a36f;
        uVar35 = pVVar33->els_num + 1;
        if (pVVar33->size < uVar35) {
          sVar63 = (uVar35 >> 1) + uVar35;
          phVar34 = (htab_ind_t *)realloc(pcVar13,sVar63 * 4);
          pVVar33->varr = phVar34;
          pVVar33->size = sVar63;
        }
        sVar63 = pVVar33->els_num;
        pVVar33->els_num = sVar63 + 1;
        pVVar33->varr[sVar63] = 0xffffffff;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      ppVar20->tpname_tab = pHVar40;
      pcVar43 = (check_ctx *)c2mir_calloc(pcVar66,0x78);
      pcVar66->check_ctx = pcVar43;
      pcVar44 = (c2m_ctx_t)new_node(pcVar66,N_I);
      __tp = (tm *)0xffffffffffffffff;
      add_pos(pcVar66,(node_t_conflict)pcVar44,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40));
      pcVar44->env[0].__jmpbuf[2] = 1;
      pcVar43->n_i1_node = (node_t_conflict)pcVar44;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar45 = (VARR_node_t *)malloc(0x18);
      pcVar43->context_stack = pVVar45;
      if (pVVar45 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar45->els_num = 0;
      pVVar45->size = 0x40;
      ppnVar46 = (node_t_conflict *)malloc(0x200);
      pVVar45->varr = ppnVar46;
      check(pcVar66,(node_t_conflict)pcVar44,(node_t_conflict)0x0);
      pcVar43->curr_scope = (node_t_conflict)0x0;
      pcVar43->func_block_scope = (node_t_conflict)0x0;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar45 = (VARR_node_t *)malloc(0x18);
      pcVar43->label_uses = pVVar45;
      if (pVVar45 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar45->els_num = 0;
      pVVar45->size = 0x40;
      ppnVar46 = (node_t_conflict *)malloc(0x200);
      pVVar45->varr = ppnVar46;
      pcVar13 = (c2m_ctx_t)0x40;
      pHVar47 = (HTAB_symbol_t *)malloc(0x40);
      if (pHVar47 == (HTAB_symbol_t *)0x0) {
LAB_0017a397:
        mir_htab_error((char *)pcVar13);
      }
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar48 = (VARR_HTAB_EL_symbol_t *)malloc(0x18);
      pHVar47->els = pVVar48;
      if (pVVar48 == (VARR_HTAB_EL_symbol_t *)0x0) goto LAB_0017a365;
      pVVar48->els_num = 0;
      pVVar48->size = 0x2000;
      pptVar67 = (token_t *)0x70000;
      pHVar49 = (HTAB_EL_symbol_t *)malloc(0x70000);
      pVVar48->varr = pHVar49;
      if (pHVar49 == (HTAB_EL_symbol_t *)0x0) goto LAB_0017a3a6;
      pVVar48->size = 0x2000;
      pVVar48->els_num = 0x2000;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar33 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar47->entries = pVVar33;
      if (pVVar33 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar33->els_num = 0;
      pVVar33->size = 0x4000;
      phVar34 = (htab_ind_t *)malloc(0x10000);
      pVVar33->varr = phVar34;
      pHVar47->arg = (void *)0x0;
      pHVar47->hash_func = symbol_hash;
      pHVar47->eq_func = symbol_eq;
      pHVar47->free_func = symbol_clear;
      pHVar47->els_num = 0;
      pHVar47->els_start = 0;
      pHVar47->els_bound = 0;
      pHVar47->collisions = 0;
      iVar10 = 0x4000;
      do {
        pVVar33 = pHVar47->entries;
        pcVar13 = (c2m_ctx_t)pVVar33->varr;
        if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a374;
        uVar35 = pVVar33->els_num + 1;
        if (pVVar33->size < uVar35) {
          sVar63 = (uVar35 >> 1) + uVar35;
          pcVar44 = (c2m_ctx_t)(sVar63 * 4);
          phVar34 = (htab_ind_t *)realloc(pcVar13,(size_t)pcVar44);
          pVVar33->varr = phVar34;
          pVVar33->size = sVar63;
        }
        sVar63 = pVVar33->els_num;
        __tp = (tm *)pVVar33->varr;
        pVVar33->els_num = sVar63 + 1;
        (&__tp->tm_sec)[sVar63] = -1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      pcVar66->symbol_tab = pHVar47;
      pcVar43->in_params_p = '\0';
      pcVar43->curr_unnamed_anon_struct_union_member = (node_t_conflict)0x0;
      pcVar13 = (c2m_ctx_t)0x40;
      pHVar50 = (HTAB_case_t *)malloc(0x40);
      if (pHVar50 == (HTAB_case_t *)0x0) goto LAB_0017a397;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar51 = (VARR_HTAB_EL_case_t *)malloc(0x18);
      pHVar50->els = pVVar51;
      if (pVVar51 == (VARR_HTAB_EL_case_t *)0x0) goto LAB_0017a365;
      pVVar51->els_num = 0;
      pVVar51->size = 0x80;
      pptVar67 = (token_t *)0x800;
      pHVar52 = (HTAB_EL_case_t *)malloc(0x800);
      pVVar51->varr = pHVar52;
      if (pHVar52 == (HTAB_EL_case_t *)0x0) goto LAB_0017a3ab;
      pVVar51->size = 0x80;
      pVVar51->els_num = 0x80;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar33 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar50->entries = pVVar33;
      if (pVVar33 == (VARR_htab_ind_t *)0x0) goto LAB_0017a365;
      pVVar33->els_num = 0;
      pVVar33->size = 0x100;
      phVar34 = (htab_ind_t *)malloc(0x400);
      pVVar33->varr = phVar34;
      pHVar50->arg = (void *)0x0;
      pHVar50->hash_func = case_hash;
      pHVar50->eq_func = case_eq;
      pHVar50->free_func = (_func_void_case_t_void_ptr *)0x0;
      pHVar50->els_num = 0;
      pHVar50->els_start = 0;
      pHVar50->els_bound = 0;
      pHVar50->collisions = 0;
      iVar10 = 0x100;
      do {
        pVVar33 = pHVar50->entries;
        pcVar13 = (c2m_ctx_t)pVVar33->varr;
        if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a379;
        uVar35 = pVVar33->els_num + 1;
        if (pVVar33->size < uVar35) {
          sVar63 = (uVar35 >> 1) + uVar35;
          pcVar44 = (c2m_ctx_t)(sVar63 * 4);
          phVar34 = (htab_ind_t *)realloc(pcVar13,(size_t)pcVar44);
          pVVar33->varr = phVar34;
          pVVar33->size = sVar63;
        }
        sVar63 = pVVar33->els_num;
        __tp = (tm *)pVVar33->varr;
        pVVar33->els_num = sVar63 + 1;
        (&__tp->tm_sec)[sVar63] = -1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      pcVar43->case_tab = pHVar50;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar53 = (VARR_decl_t *)malloc(0x18);
      pcVar43->func_decls_for_allocation = pVVar53;
      if (pVVar53 == (VARR_decl_t *)0x0) goto LAB_0017a365;
      pVVar53->els_num = 0;
      pVVar53->size = 0x400;
      ppdVar54 = (decl_t *)malloc(0x2000);
      pVVar53->varr = ppdVar54;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar45 = (VARR_node_t *)malloc(0x18);
      pcVar43->possible_incomplete_decls = pVVar45;
      if (pVVar45 == (VARR_node_t *)0x0) goto LAB_0017a365;
      pVVar45->els_num = 0;
      pVVar45->size = 0x200;
      ppnVar46 = (node_t_conflict *)malloc(0x1000);
      pVVar45->varr = ppnVar46;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar26 = (VARR_char_ptr_t *)malloc(0x18);
      pcVar66->headers = pVVar26;
      if (pVVar26 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
      pVVar26->els_num = 0;
      pVVar26->size = 0x40;
      ppcVar27 = (char_ptr_t *)malloc(0x200);
      pVVar26->varr = ppcVar27;
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar26 = (VARR_char_ptr_t *)malloc(0x18);
      pcVar66->system_headers = pVVar26;
      if (pVVar26 == (VARR_char_ptr_t *)0x0) goto LAB_0017a365;
      pVVar26->els_num = 0;
      pVVar26->size = 0x40;
      ppcVar27 = (char_ptr_t *)malloc(0x200);
      pVVar26->varr = ppcVar27;
      pcVar56 = pcVar66->options;
      if (pcVar56->include_dirs_num != 0) {
        uVar35 = 0;
        do {
          pVVar26 = pcVar66->headers;
          pcVar13 = (c2m_ctx_t)pVVar26->varr;
          if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a383;
          pcVar17 = pcVar56->include_dirs[uVar35];
          uVar55 = pVVar26->els_num + 1;
          if (pVVar26->size < uVar55) {
            sVar63 = (uVar55 >> 1) + uVar55;
            pcVar44 = (c2m_ctx_t)(sVar63 * 8);
            ppcVar27 = (char_ptr_t *)realloc(pcVar13,(size_t)pcVar44);
            pVVar26->varr = ppcVar27;
            pVVar26->size = sVar63;
          }
          sVar63 = pVVar26->els_num;
          pVVar26->els_num = sVar63 + 1;
          pVVar26->varr[sVar63] = pcVar17;
          pVVar26 = pcVar66->system_headers;
          pcVar13 = (c2m_ctx_t)pVVar26->varr;
          if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a388;
          pcVar17 = pcVar66->options->include_dirs[uVar35];
          uVar55 = pVVar26->els_num + 1;
          if (pVVar26->size < uVar55) {
            sVar63 = (uVar55 >> 1) + uVar55;
            pcVar44 = (c2m_ctx_t)(sVar63 * 8);
            ppcVar27 = (char_ptr_t *)realloc(pcVar13,(size_t)pcVar44);
            pVVar26->varr = ppcVar27;
            pVVar26->size = sVar63;
          }
          sVar63 = pVVar26->els_num;
          __tp = (tm *)pVVar26->varr;
          pVVar26->els_num = sVar63 + 1;
          *(char **)(&__tp->tm_sec + sVar63 * 2) = pcVar17;
          uVar35 = uVar35 + 1;
          pcVar56 = pcVar66->options;
        } while (uVar35 < pcVar56->include_dirs_num);
      }
      pVVar26 = pcVar66->headers;
      pptVar67 = (token_t *)pVVar26->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3b0;
      uVar35 = pVVar26->els_num + 1;
      if (pVVar26->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pcVar44 = (c2m_ctx_t)(sVar63 * 8);
        ppcVar27 = (char_ptr_t *)realloc(pptVar67,(size_t)pcVar44);
        pVVar26->varr = ppcVar27;
        pVVar26->size = sVar63;
      }
      sVar63 = pVVar26->els_num;
      __tp = (tm *)pVVar26->varr;
      pVVar26->els_num = sVar63 + 1;
      *(undefined8 *)(&__tp->tm_sec + sVar63 * 2) = 0;
      pVVar26 = pcVar66->system_headers;
      pptVar67 = (token_t *)pVVar26->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3b5;
      uVar35 = pVVar26->els_num + 1;
      if (pVVar26->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pcVar44 = (c2m_ctx_t)(sVar63 * 8);
        ppcVar27 = (char_ptr_t *)realloc(pptVar67,(size_t)pcVar44);
        pVVar26->varr = ppcVar27;
        pVVar26->size = sVar63;
      }
      sVar63 = pVVar26->els_num;
      __tp = (tm *)pVVar26->varr;
      pVVar26->els_num = sVar63 + 1;
      *(char **)(&__tp->tm_sec + sVar63 * 2) = "/usr/local/include";
      pVVar26 = pcVar66->system_headers;
      pptVar67 = (token_t *)pVVar26->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3ba;
      uVar35 = pVVar26->els_num + 1;
      if (pVVar26->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pcVar44 = (c2m_ctx_t)(sVar63 * 8);
        ppcVar27 = (char_ptr_t *)realloc(pptVar67,(size_t)pcVar44);
        pVVar26->varr = ppcVar27;
        pVVar26->size = sVar63;
      }
      sVar63 = pVVar26->els_num;
      __tp = (tm *)pVVar26->varr;
      pVVar26->els_num = sVar63 + 1;
      *(char **)(&__tp->tm_sec + sVar63 * 2) = "/usr/include/x86_64-linux-gnu";
      pVVar26 = pcVar66->system_headers;
      pptVar67 = (token_t *)pVVar26->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3bf;
      uVar35 = pVVar26->els_num + 1;
      if (pVVar26->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pcVar44 = (c2m_ctx_t)(sVar63 * 8);
        ppcVar27 = (char_ptr_t *)realloc(pptVar67,(size_t)pcVar44);
        pVVar26->varr = ppcVar27;
        pVVar26->size = sVar63;
      }
      sVar63 = pVVar26->els_num;
      __tp = (tm *)pVVar26->varr;
      pVVar26->els_num = sVar63 + 1;
      *(char **)(&__tp->tm_sec + sVar63 * 2) = "/usr/include";
      pVVar26 = pcVar66->system_headers;
      pptVar67 = (token_t *)pVVar26->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3c4;
      uVar35 = pVVar26->els_num + 1;
      if (pVVar26->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pcVar44 = (c2m_ctx_t)(sVar63 * 8);
        ppcVar27 = (char_ptr_t *)realloc(pptVar67,(size_t)pcVar44);
        pVVar26->varr = ppcVar27;
        pVVar26->size = sVar63;
      }
      sVar63 = pVVar26->els_num;
      __tp = (tm *)pVVar26->varr;
      pVVar26->els_num = sVar63 + 1;
      *(undefined8 *)(&__tp->tm_sec + sVar63 * 2) = 0;
      if (pcVar66->headers == (VARR_char_ptr_t *)0x0) goto LAB_0017a3c9;
      pcVar66->header_dirs = pcVar66->headers->varr;
      if (pcVar66->system_headers != (VARR_char_ptr_t *)0x0) {
        pcVar66->system_header_dirs = pcVar66->system_headers->varr;
        pcVar56 = pcVar66->options;
        if (pcVar56->macro_commands_num != 0) {
          uVar35 = 0;
          do {
            pcVar17 = pcVar56->macro_commands[uVar35].name;
            pcVar65 = pcVar56->macro_commands[uVar35].def;
            ppStack_168 = pcVar66->pre_ctx;
            if (pcVar65 == (char *)0x0) {
              pos_01.lno = 1;
              pos_01.ln_pos = 0;
              pos_01.fname = "<command-line>";
              ptVar12 = new_id_token(pcVar66,pos_01,pcVar17);
              iVar10 = check_id_p(pcVar66,ptVar12->repr);
              if (iVar10 != 0) {
                tStack_1b0._0_8_ = ptVar12;
                HTAB_macro_t_do(ppStack_168->macro_tab,(macro_t)&tStack_1b0,HTAB_DELETE,&pmStack_178
                               );
              }
            }
            else {
              pptVar67 = (token_t *)&DAT_00000018;
              uStack_160 = uVar35;
              pVVar23 = (VARR_token_t *)malloc(0x18);
              if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
              pVVar23->els_num = 0;
              pVVar23->size = 0x10;
              pptVar67 = (token_t *)malloc(0x80);
              pVVar23->varr = pptVar67;
              pos_00.lno = 1;
              pos_00.ln_pos = 0;
              pos_00.fname = "<command-line>";
              pcVar13 = pcVar66;
              ptVar12 = new_id_token(pcVar66,pos_00,pcVar17);
              pVVar16 = pcVar66->temp_string;
              if ((pVVar16 == (VARR_char *)0x0) || (pVVar16->varr == (char *)0x0))
              goto LAB_0017a37e;
              pVVar16->els_num = 0;
              cVar1 = *pcVar65;
              pcVar66 = pcStack_170;
              while (pcStack_170 = pcVar66, cVar1 != '\0') {
                pcVar65 = pcVar65 + 1;
                pVVar16 = pcVar66->temp_string;
                pptVar67 = (token_t *)pVVar16->varr;
                if (pptVar67 == (token_t *)0x0) {
                  compile_init_cold_3();
                  goto LAB_0017a360;
                }
                uVar35 = pVVar16->els_num + 1;
                if (pVVar16->size < uVar35) {
                  sVar25 = (uVar35 >> 1) + uVar35;
                  pcVar17 = (char *)realloc(pptVar67,sVar25);
                  pVVar16->varr = pcVar17;
                  pVVar16->size = sVar25;
                }
                sVar63 = pVVar16->els_num;
                pVVar16->els_num = sVar63 + 1;
                pVVar16->varr[sVar63] = cVar1;
                pcVar66 = pcStack_170;
                cVar1 = *pcVar65;
              }
              pVVar16 = pcVar66->temp_string;
              pcVar13 = (c2m_ctx_t)pVVar16->varr;
              if (pcVar13 == (c2m_ctx_t)0x0) goto LAB_0017a38d;
              uVar35 = pVVar16->els_num + 1;
              if (pVVar16->size < uVar35) {
                sVar25 = (uVar35 >> 1) + uVar35;
                pcVar17 = (char *)realloc(pcVar13,sVar25);
                pVVar16->varr = pcVar17;
                pVVar16->size = sVar25;
              }
              sVar63 = pVVar16->els_num;
              pVVar16->els_num = sVar63 + 1;
              pVVar16->varr[sVar63] = '\0';
              pcVar13 = (c2m_ctx_t)pcVar66->temp_string;
              reverse((VARR_char *)pcVar13);
              if (pcVar66->temp_string == (VARR_char *)0x0) goto LAB_0017a392;
              pos.lno = 1;
              pos.ln_pos = 0;
              pos.fname = "<command-line>";
              set_string_stream(pcVar66,pcVar66->temp_string->varr,pos,
                                (_func_void_char_ptr_VARR_char_ptr *)0x0);
              while( true ) {
                ptVar57 = get_next_pptoken_1(pcVar66,0);
                if ((*(short *)ptVar57 == 0x13d) || (*(short *)ptVar57 == 0x147)) break;
                pptVar67 = pVVar23->varr;
                if (pptVar67 == (token_t *)0x0) goto LAB_0017a360;
                uVar35 = pVVar23->els_num + 1;
                if (pVVar23->size < uVar35) {
                  sVar63 = (uVar35 >> 1) + uVar35;
                  pptVar67 = (token_t *)realloc(pptVar67,sVar63 * 8);
                  pVVar23->varr = pptVar67;
                  pVVar23->size = sVar63;
                }
                sVar63 = pVVar23->els_num;
                pVVar23->els_num = sVar63 + 1;
                pVVar23->varr[sVar63] = ptVar57;
              }
              iVar10 = check_id_p(pcVar66,ptVar12->repr);
              ppVar24 = ppStack_168;
              uVar35 = uStack_160;
              if (iVar10 != 0) {
                tStack_1b0._0_8_ = ptVar12;
                iVar10 = HTAB_macro_t_do(ppStack_168->macro_tab,(macro_t)&tStack_1b0,HTAB_FIND,
                                         &pmStack_178);
                if (iVar10 != 0) {
                  iVar10 = replacement_eq_p(pmStack_178->replacement,pVVar23);
                  if ((iVar10 == 0) &&
                     (pFVar3 = (FILE *)pcVar66->options->message_file, pFVar3 != (FILE *)0x0)) {
                    fprintf(pFVar3,"warning -- redefinition of macro %s on the command line\n",
                            ptVar12->repr);
                  }
                  HTAB_macro_t_do(ppVar24->macro_tab,(macro_t)&tStack_1b0,HTAB_DELETE,&pmStack_178);
                }
                new_macro(pcVar66,(token_t)tStack_1b0._0_8_,(VARR_token_t *)0x0,pVVar23);
                uVar35 = uStack_160;
              }
            }
            uVar35 = uVar35 + 1;
            pcVar56 = pcVar66->options;
          } while (uVar35 < pcVar56->macro_commands_num);
        }
        pptVar67 = (token_t *)&DAT_00000018;
        pVVar45 = (VARR_node_t *)malloc(0x18);
        pcVar66->call_nodes = pVVar45;
        if (pVVar45 != (VARR_node_t *)0x0) {
          pVVar45->els_num = 0;
          pVVar45->size = 0x80;
          ppnVar46 = (node_t_conflict *)malloc(0x400);
          pVVar45->varr = ppnVar46;
          pptVar67 = (token_t *)&DAT_00000018;
          pVVar45 = (VARR_node_t *)malloc(0x18);
          pcVar66->containing_anon_members = pVVar45;
          if (pVVar45 != (VARR_node_t *)0x0) {
            pVVar45->els_num = 0;
            pVVar45->size = 8;
            ppnVar46 = (node_t_conflict *)malloc(0x40);
            pVVar45->varr = ppnVar46;
            pptVar67 = (token_t *)&DAT_00000018;
            pVVar58 = (VARR_init_object_t *)malloc(0x18);
            pcVar66->init_object_path = pVVar58;
            if (pVVar58 != (VARR_init_object_t *)0x0) {
              pVVar58->els_num = 0;
              pVVar58->size = 8;
              piVar59 = (init_object_t *)malloc(0xc0);
              pVVar58->varr = piVar59;
              return (int)piVar59;
            }
          }
        }
        goto LAB_0017a365;
      }
      goto LAB_0017a3ce;
    }
    pptVar67 = (token_t *)&DAT_00000018;
    pVVar23 = (VARR_token_t *)malloc(0x18);
    if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
    pVVar23->els_num = 0;
    pVVar23->size = 1;
    pptVar67 = (token_t *)malloc(8);
    pVVar23->varr = pptVar67;
    __tp = (tm *)0x1ba543;
    pcVar44 = (c2m_ctx_t)0x0;
    ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
    pptVar67 = pVVar23->varr;
    if (pptVar67 != (token_t *)0x0) {
      uVar35 = pVVar23->els_num + 1;
      if (pVVar23->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pptVar67 = (token_t *)realloc(pptVar67,sVar63 * 8);
        pVVar23->varr = pptVar67;
        pVVar23->size = sVar63;
      }
      sVar63 = pVVar23->els_num;
      pVVar23->els_num = sVar63 + 1;
      pVVar23->varr[sVar63] = ptVar12;
      ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_include");
      new_macro(pcVar66,ptVar12,pVVar23,(VARR_token_t *)0x0);
      pptVar67 = (token_t *)&DAT_00000018;
      pVVar23 = (VARR_token_t *)malloc(0x18);
      if (pVVar23 == (VARR_token_t *)0x0) goto LAB_0017a365;
      pVVar23->els_num = 0;
      pVVar23->size = 1;
      pptVar67 = (token_t *)malloc(8);
      pVVar23->varr = pptVar67;
      __tp = (tm *)0x1ba543;
      pcVar44 = (c2m_ctx_t)0x0;
      ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
      pptVar67 = pVVar23->varr;
      if (pptVar67 == (token_t *)0x0) goto LAB_0017a3d8;
      uVar35 = pVVar23->els_num + 1;
      if (pVVar23->size < uVar35) {
        sVar63 = (uVar35 >> 1) + uVar35;
        pptVar67 = (token_t *)realloc(pptVar67,sVar63 * 8);
        pVVar23->varr = pptVar67;
        pVVar23->size = sVar63;
      }
      sVar63 = pVVar23->els_num;
      pVVar23->els_num = sVar63 + 1;
      pVVar23->varr[sVar63] = ptVar12;
      ptVar12 = new_id_token(pcVar66,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_builtin");
      new_macro(pcVar66,ptVar12,pVVar23,(VARR_token_t *)0x0);
      goto LAB_00179040;
    }
  }
  compile_init_cold_22();
LAB_0017a3d8:
  compile_init_cold_21();
  if (fname == (char *)0x0) {
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
  }
  ptVar12 = pptVar67[0x22];
  if (((ptVar12 != (token_t)0x0) && (pFVar3 = *(FILE **)ptVar12, pFVar3 != (FILE *)0x0)) &&
     (pFVar3 != _stdin)) {
    fgetpos(pFVar3,(fpos_t *)(ptVar12 + 1));
    fclose(*(FILE **)pptVar67[0x22]);
    *(undefined8 *)pptVar67[0x22] = 0;
  }
  psVar60 = new_stream((FILE *)pcVar44,fname,(_func_int_c2m_ctx_t *)__tp);
  pptVar67[0x22] = (token_t)psVar60;
  ptVar12 = pptVar67[0x21];
  pvVar61 = *(void **)&(ptVar12->pos).lno;
  if (pvVar61 != (void *)0x0) {
    pcVar17 = (char *)(*(long *)ptVar12 + 1);
    if ((ptVar12->pos).fname < pcVar17) {
      pvVar61 = realloc(pvVar61,(long)(pcVar17 + ((ulong)pcVar17 >> 1)) * 8);
      *(void **)&(ptVar12->pos).lno = pvVar61;
      (ptVar12->pos).fname = pcVar17 + ((ulong)pcVar17 >> 1);
    }
    lVar4 = *(long *)ptVar12;
    lVar8 = *(long *)&(ptVar12->pos).lno;
    *(long *)ptVar12 = lVar4 + 1;
    *(stream_t *)(lVar8 + lVar4 * 8) = psVar60;
    return (int)lVar4;
  }
  add_stream_cold_1();
  iVar10 = (**(code **)((long)pvVar61 + 0x148))(*(undefined8 *)((long)pvVar61 + 0x150));
  return iVar10;
}

Assistant:

int c2mir_compile (MIR_context_t ctx, struct c2mir_options *ops, int (*getc_func) (void *),
                   void *getc_data, const char *source_name, FILE *output_file) {
  struct c2m_ctx *c2m_ctx = *c2m_ctx_loc (ctx);
  double start_time = real_usec_time ();
  node_t r;
  unsigned n_error_before;
  MIR_module_t m;

  if (c2m_ctx == NULL) return 0;
  if (setjmp (c2m_ctx->env)) {
    compile_finish (c2m_ctx);
    return 0;
  }
  compile_init (c2m_ctx, ops, getc_func, getc_data);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR init end           -- %.0f usec\n",
             real_usec_time () - start_time);
  add_stream (c2m_ctx, NULL, source_name, top_level_getc);
  if (!c2m_options->no_prepro_p) add_standard_includes (c2m_ctx);
  pre (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "  C2MIR preprocessor end    -- %.0f usec\n",
             real_usec_time () - start_time);
  if (!c2m_options->prepro_only_p) {
    r = parse (c2m_ctx);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL)
      fprintf (c2m_options->message_file, "  C2MIR parser end          -- %.0f usec\n",
               real_usec_time () - start_time);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL && n_errors)
      fprintf (c2m_options->message_file, "parser - FAIL\n");
    if (!c2m_options->syntax_only_p) {
      n_error_before = n_errors;
      do_context (c2m_ctx, r);
      if (n_errors > n_error_before) {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, FALSE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "C2MIR context checker - FAIL\n");
      } else {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, TRUE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR context checker end -- %.0f usec\n",
                   real_usec_time () - start_time);
        m = MIR_new_module (ctx, get_module_name (c2m_ctx));
        gen_mir (c2m_ctx, r);
        if ((c2m_options->asm_p || c2m_options->object_p) && n_errors == 0) {
          if (strcmp (source_name, COMMAND_LINE_SOURCE_NAME) == 0) {
            MIR_output_module (ctx, c2m_options->message_file, m);
          } else if (output_file != NULL) {
            (c2m_options->asm_p ? MIR_output_module : MIR_write_module) (ctx, output_file, m);
            if (ferror (output_file) || fclose (output_file)) {
              fprintf (c2m_options->message_file, "C2MIR error in writing mir for source file %s\n",
                       source_name);
              n_errors++;
            }
          }
        }
        MIR_finish_module (ctx);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR generator end       -- %.0f usec\n",
                   real_usec_time () - start_time);
      }
    }
  }
  compile_finish (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR compiler end                -- %.0f usec\n",
             real_usec_time () - start_time);
  return n_errors == 0;
}